

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNv_intersector.h
# Opt level: O1

void embree::avx512::CurveNvIntersector1<8>::
     intersect_t<embree::avx512::RibbonCurve1Intersector1<embree::BezierCurveT,8>,embree::avx512::Intersect1EpilogMU<8,true>>
               (Precalculations *pre,RayHit *ray,RayQueryContext *context,Primitive *prim)

{
  int iVar1;
  int iVar2;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar3;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar4;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  Primitive PVar11;
  int iVar12;
  Geometry *pGVar13;
  RTCFilterFunctionN p_Var14;
  bool bVar15;
  bool bVar16;
  bool bVar17;
  bool bVar18;
  bool bVar19;
  bool bVar20;
  bool bVar21;
  undefined8 uVar22;
  long lVar23;
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  long lVar71;
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [32];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  byte bVar77;
  byte bVar78;
  ulong uVar79;
  uint uVar80;
  uint uVar81;
  uint uVar82;
  uint uVar83;
  ulong uVar84;
  long lVar85;
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  ulong uVar86;
  Primitive *pPVar87;
  uint uVar88;
  ulong uVar89;
  byte bVar90;
  float fVar91;
  float fVar92;
  float fVar139;
  float fVar140;
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar98 [16];
  float fVar141;
  float fVar143;
  float fVar144;
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  undefined1 auVar130 [32];
  float fVar142;
  float fVar145;
  float fVar146;
  undefined1 auVar131 [32];
  undefined1 auVar132 [32];
  undefined1 auVar133 [32];
  undefined1 auVar134 [32];
  undefined1 auVar135 [32];
  undefined1 auVar136 [32];
  undefined1 auVar137 [32];
  undefined1 auVar138 [32];
  float fVar147;
  undefined4 uVar148;
  undefined8 uVar149;
  undefined1 auVar150 [32];
  undefined1 auVar151 [32];
  undefined1 auVar152 [32];
  undefined1 auVar153 [32];
  undefined1 auVar154 [32];
  undefined1 auVar155 [32];
  undefined1 auVar156 [32];
  undefined1 auVar157 [32];
  undefined1 auVar158 [32];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [32];
  float fVar170;
  float fVar171;
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [32];
  undefined1 auVar177 [32];
  float fVar179;
  undefined1 auVar178 [64];
  float fVar184;
  float fVar185;
  float fVar186;
  undefined1 auVar180 [32];
  undefined1 auVar181 [32];
  undefined1 auVar182 [32];
  undefined1 auVar183 [32];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [32];
  undefined1 auVar192 [32];
  undefined1 auVar193 [32];
  undefined1 auVar194 [32];
  undefined1 auVar195 [64];
  undefined1 auVar196 [32];
  undefined1 auVar197 [32];
  undefined1 auVar198 [64];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [32];
  undefined1 auVar202 [16];
  undefined1 auVar203 [32];
  undefined1 auVar204 [32];
  undefined1 auVar205 [32];
  undefined1 auVar206 [32];
  undefined1 auVar207 [32];
  undefined1 auVar208 [32];
  undefined1 auVar209 [64];
  undefined1 auVar210 [64];
  undefined1 in_ZMM20 [64];
  undefined1 in_ZMM21 [64];
  undefined1 auVar211 [64];
  undefined1 auVar212 [16];
  undefined1 auVar213 [64];
  undefined1 auVar214 [64];
  undefined1 auVar215 [64];
  undefined1 auVar216 [64];
  RTCFilterFunctionNArguments args;
  RibbonHit<embree::CubicBezierCurve<embree::Vec3fx>,_8> bhit;
  int local_64c;
  Precalculations *local_648;
  RayHit *local_640;
  RayQueryContext *local_638;
  Primitive *local_630;
  ulong local_628;
  undefined1 local_620 [16];
  undefined1 local_610 [16];
  undefined1 local_600 [32];
  RTCFilterFunctionNArguments local_5d0;
  undefined1 local_5a0 [32];
  uint local_580;
  undefined4 uStack_57c;
  undefined8 uStack_578;
  undefined8 local_570;
  undefined4 local_568;
  float local_564;
  undefined4 local_560;
  uint local_55c;
  undefined4 local_558;
  uint local_554;
  uint local_550;
  undefined1 local_540 [32];
  undefined1 local_520 [32];
  undefined1 local_4f0 [8];
  undefined8 uStack_4e8;
  undefined1 local_4e0 [16];
  undefined1 local_4d0 [16];
  undefined1 local_4c0 [32];
  undefined1 local_4a0 [32];
  undefined1 local_480 [32];
  undefined1 local_460 [32];
  undefined8 local_440;
  undefined8 uStack_438;
  RTCRayQueryContext *local_430;
  undefined8 uStack_428;
  undefined1 local_420 [32];
  uint local_400;
  uint uStack_3fc;
  uint uStack_3f8;
  uint uStack_3f4;
  uint uStack_3f0;
  uint uStack_3ec;
  uint uStack_3e8;
  uint uStack_3e4;
  undefined1 local_3e0 [32];
  undefined1 local_3c0 [32];
  undefined1 local_3a0 [8];
  float fStack_398;
  float fStack_394;
  float fStack_390;
  float fStack_38c;
  float fStack_388;
  float fStack_384;
  undefined1 local_380 [32];
  undefined1 local_360 [32];
  undefined1 local_340 [32];
  undefined4 local_320;
  int local_31c;
  undefined1 local_310 [16];
  undefined8 local_300;
  undefined8 uStack_2f8;
  undefined8 local_2f0;
  undefined8 uStack_2e8;
  undefined8 local_2e0;
  undefined8 uStack_2d8;
  byte local_2d0;
  float local_2c0 [4];
  float fStack_2b0;
  float fStack_2ac;
  float fStack_2a8;
  float fStack_2a4;
  undefined8 local_2a0;
  undefined8 uStack_298;
  undefined8 uStack_290;
  undefined8 uStack_288;
  undefined1 local_280 [32];
  undefined1 local_260 [32];
  undefined1 local_240 [32];
  undefined1 local_220 [32];
  undefined8 local_1f0;
  undefined8 uStack_1e8;
  undefined8 local_1e0;
  undefined8 uStack_1d8;
  undefined8 local_1d0;
  undefined8 uStack_1c8;
  undefined1 local_1c0 [32];
  undefined1 local_1a0 [32];
  undefined1 local_180 [32];
  undefined1 local_160 [32];
  undefined1 local_140 [8];
  float fStack_138;
  float fStack_134;
  float fStack_130;
  float fStack_12c;
  float fStack_128;
  undefined4 uStack_124;
  undefined1 local_120 [32];
  undefined1 local_100 [32];
  undefined1 local_e0 [32];
  undefined1 local_c0 [32];
  undefined1 local_a0 [32];
  undefined1 local_80 [32];
  
  PVar11 = prim[1];
  uVar86 = (ulong)(byte)PVar11;
  lVar71 = uVar86 * 0x19;
  fVar171 = *(float *)(prim + lVar71 + 0x12);
  auVar159 = vsubps_avx((undefined1  [16])(ray->super_RayK<1>).org.field_0,
                        *(undefined1 (*) [16])(prim + lVar71 + 6));
  fVar170 = fVar171 * auVar159._0_4_;
  fVar147 = fVar171 * (ray->super_RayK<1>).dir.field_0.m128[0];
  auVar95._8_8_ = 0;
  auVar95._0_8_ = *(ulong *)(prim + uVar86 * 4 + 6);
  auVar104 = vpmovsxbd_avx2(auVar95);
  auVar93._8_8_ = 0;
  auVar93._0_8_ = *(ulong *)(prim + uVar86 * 5 + 6);
  auVar102 = vpmovsxbd_avx2(auVar93);
  auVar104 = vcvtdq2ps_avx(auVar104);
  auVar102 = vcvtdq2ps_avx(auVar102);
  auVar212._8_8_ = 0;
  auVar212._0_8_ = *(ulong *)(prim + uVar86 * 6 + 6);
  auVar115 = vpmovsxbd_avx2(auVar212);
  auVar115 = vcvtdq2ps_avx(auVar115);
  auVar6._8_8_ = 0;
  auVar6._0_8_ = *(ulong *)(prim + uVar86 * 0xb + 6);
  auVar114 = vpmovsxbd_avx2(auVar6);
  auVar7._8_8_ = 0;
  auVar7._0_8_ = *(ulong *)(prim + (ulong)((uint)(byte)PVar11 * 0xc) + 6);
  auVar108 = vpmovsxbd_avx2(auVar7);
  auVar114 = vcvtdq2ps_avx(auVar114);
  auVar105 = vcvtdq2ps_avx(auVar108);
  auVar8._8_8_ = 0;
  auVar8._0_8_ = *(ulong *)(prim + (uint)(byte)PVar11 * 0xc + uVar86 + 6);
  auVar103 = vpmovsxbd_avx2(auVar8);
  auVar103 = vcvtdq2ps_avx(auVar103);
  uVar89 = (ulong)(uint)((int)(uVar86 * 9) * 2);
  auVar9._8_8_ = 0;
  auVar9._0_8_ = *(ulong *)(prim + uVar89 + 6);
  auVar113 = vpmovsxbd_avx2(auVar9);
  auVar113 = vcvtdq2ps_avx(auVar113);
  auVar94._8_8_ = 0;
  auVar94._0_8_ = *(ulong *)(prim + uVar89 + uVar86 + 6);
  auVar112 = vpmovsxbd_avx2(auVar94);
  auVar112 = vcvtdq2ps_avx(auVar112);
  uVar79 = (ulong)(uint)((int)(uVar86 * 5) << 2);
  auVar10._8_8_ = 0;
  auVar10._0_8_ = *(ulong *)(prim + uVar79 + 6);
  auVar101 = vpmovsxbd_avx2(auVar10);
  auVar107 = vcvtdq2ps_avx(auVar101);
  auVar204._4_4_ = fVar147;
  auVar204._0_4_ = fVar147;
  auVar204._8_4_ = fVar147;
  auVar204._12_4_ = fVar147;
  auVar204._16_4_ = fVar147;
  auVar204._20_4_ = fVar147;
  auVar204._24_4_ = fVar147;
  auVar204._28_4_ = fVar147;
  auVar206._8_4_ = 1;
  auVar206._0_8_ = 0x100000001;
  auVar206._12_4_ = 1;
  auVar206._16_4_ = 1;
  auVar206._20_4_ = 1;
  auVar206._24_4_ = 1;
  auVar206._28_4_ = 1;
  auVar99 = vbroadcastss_avx512vl(ZEXT416(2));
  auVar109 = ZEXT1632(CONCAT412(fVar171 * (ray->super_RayK<1>).dir.field_0.m128[3],
                                CONCAT48(fVar171 * (ray->super_RayK<1>).dir.field_0.m128[2],
                                         CONCAT44(fVar171 * (ray->super_RayK<1>).dir.field_0.m128[1]
                                                  ,fVar147))));
  auVar106 = vpermps_avx2(auVar206,auVar109);
  auVar100 = vpermps_avx512vl(auVar99,auVar109);
  fVar147 = auVar100._0_4_;
  fVar184 = auVar100._4_4_;
  auVar109._4_4_ = fVar184 * auVar115._4_4_;
  auVar109._0_4_ = fVar147 * auVar115._0_4_;
  fVar185 = auVar100._8_4_;
  auVar109._8_4_ = fVar185 * auVar115._8_4_;
  fVar186 = auVar100._12_4_;
  auVar109._12_4_ = fVar186 * auVar115._12_4_;
  fVar179 = auVar100._16_4_;
  auVar109._16_4_ = fVar179 * auVar115._16_4_;
  fVar91 = auVar100._20_4_;
  auVar109._20_4_ = fVar91 * auVar115._20_4_;
  fVar92 = auVar100._24_4_;
  auVar109._24_4_ = fVar92 * auVar115._24_4_;
  auVar109._28_4_ = auVar108._28_4_;
  auVar108._4_4_ = auVar103._4_4_ * fVar184;
  auVar108._0_4_ = auVar103._0_4_ * fVar147;
  auVar108._8_4_ = auVar103._8_4_ * fVar185;
  auVar108._12_4_ = auVar103._12_4_ * fVar186;
  auVar108._16_4_ = auVar103._16_4_ * fVar179;
  auVar108._20_4_ = auVar103._20_4_ * fVar91;
  auVar108._24_4_ = auVar103._24_4_ * fVar92;
  auVar108._28_4_ = auVar101._28_4_;
  auVar101._4_4_ = auVar107._4_4_ * fVar184;
  auVar101._0_4_ = auVar107._0_4_ * fVar147;
  auVar101._8_4_ = auVar107._8_4_ * fVar185;
  auVar101._12_4_ = auVar107._12_4_ * fVar186;
  auVar101._16_4_ = auVar107._16_4_ * fVar179;
  auVar101._20_4_ = auVar107._20_4_ * fVar91;
  auVar101._24_4_ = auVar107._24_4_ * fVar92;
  auVar101._28_4_ = auVar100._28_4_;
  auVar95 = vfmadd231ps_fma(auVar109,auVar106,auVar102);
  auVar93 = vfmadd231ps_fma(auVar108,auVar106,auVar105);
  auVar212 = vfmadd231ps_fma(auVar101,auVar112,auVar106);
  auVar95 = vfmadd231ps_fma(ZEXT1632(auVar95),auVar204,auVar104);
  auVar93 = vfmadd231ps_fma(ZEXT1632(auVar93),auVar204,auVar114);
  auVar212 = vfmadd231ps_fma(ZEXT1632(auVar212),auVar113,auVar204);
  auVar205._4_4_ = fVar170;
  auVar205._0_4_ = fVar170;
  auVar205._8_4_ = fVar170;
  auVar205._12_4_ = fVar170;
  auVar205._16_4_ = fVar170;
  auVar205._20_4_ = fVar170;
  auVar205._24_4_ = fVar170;
  auVar205._28_4_ = fVar170;
  auVar101 = ZEXT1632(CONCAT412(fVar171 * auVar159._12_4_,
                                CONCAT48(fVar171 * auVar159._8_4_,
                                         CONCAT44(fVar171 * auVar159._4_4_,fVar170))));
  auVar108 = vpermps_avx2(auVar206,auVar101);
  auVar101 = vpermps_avx512vl(auVar99,auVar101);
  fVar171 = auVar101._0_4_;
  fVar147 = auVar101._4_4_;
  auVar106._4_4_ = fVar147 * auVar115._4_4_;
  auVar106._0_4_ = fVar171 * auVar115._0_4_;
  fVar184 = auVar101._8_4_;
  auVar106._8_4_ = fVar184 * auVar115._8_4_;
  fVar185 = auVar101._12_4_;
  auVar106._12_4_ = fVar185 * auVar115._12_4_;
  fVar186 = auVar101._16_4_;
  auVar106._16_4_ = fVar186 * auVar115._16_4_;
  fVar179 = auVar101._20_4_;
  auVar106._20_4_ = fVar179 * auVar115._20_4_;
  fVar91 = auVar101._24_4_;
  auVar106._24_4_ = fVar91 * auVar115._24_4_;
  auVar106._28_4_ = 1;
  auVar99._4_4_ = auVar103._4_4_ * fVar147;
  auVar99._0_4_ = auVar103._0_4_ * fVar171;
  auVar99._8_4_ = auVar103._8_4_ * fVar184;
  auVar99._12_4_ = auVar103._12_4_ * fVar185;
  auVar99._16_4_ = auVar103._16_4_ * fVar186;
  auVar99._20_4_ = auVar103._20_4_ * fVar179;
  auVar99._24_4_ = auVar103._24_4_ * fVar91;
  auVar99._28_4_ = auVar115._28_4_;
  auVar103._4_4_ = auVar107._4_4_ * fVar147;
  auVar103._0_4_ = auVar107._0_4_ * fVar171;
  auVar103._8_4_ = auVar107._8_4_ * fVar184;
  auVar103._12_4_ = auVar107._12_4_ * fVar185;
  auVar103._16_4_ = auVar107._16_4_ * fVar186;
  auVar103._20_4_ = auVar107._20_4_ * fVar179;
  auVar103._24_4_ = auVar107._24_4_ * fVar91;
  auVar103._28_4_ = auVar101._28_4_;
  auVar6 = vfmadd231ps_fma(auVar106,auVar108,auVar102);
  auVar7 = vfmadd231ps_fma(auVar99,auVar108,auVar105);
  auVar8 = vfmadd231ps_fma(auVar103,auVar108,auVar112);
  auVar6 = vfmadd231ps_fma(ZEXT1632(auVar6),auVar205,auVar104);
  auVar7 = vfmadd231ps_fma(ZEXT1632(auVar7),auVar205,auVar114);
  auVar196._8_4_ = 0x7fffffff;
  auVar196._0_8_ = 0x7fffffff7fffffff;
  auVar196._12_4_ = 0x7fffffff;
  auVar196._16_4_ = 0x7fffffff;
  auVar196._20_4_ = 0x7fffffff;
  auVar196._24_4_ = 0x7fffffff;
  auVar196._28_4_ = 0x7fffffff;
  auVar8 = vfmadd231ps_fma(ZEXT1632(auVar8),auVar205,auVar113);
  auVar104 = vandps_avx(ZEXT1632(auVar95),auVar196);
  auVar193._8_4_ = 0x219392ef;
  auVar193._0_8_ = 0x219392ef219392ef;
  auVar193._12_4_ = 0x219392ef;
  auVar193._16_4_ = 0x219392ef;
  auVar193._20_4_ = 0x219392ef;
  auVar193._24_4_ = 0x219392ef;
  auVar193._28_4_ = 0x219392ef;
  uVar89 = vcmpps_avx512vl(auVar104,auVar193,1);
  bVar15 = (bool)((byte)uVar89 & 1);
  auVar100._0_4_ = (uint)bVar15 * 0x219392ef | (uint)!bVar15 * auVar95._0_4_;
  bVar15 = (bool)((byte)(uVar89 >> 1) & 1);
  auVar100._4_4_ = (uint)bVar15 * 0x219392ef | (uint)!bVar15 * auVar95._4_4_;
  bVar15 = (bool)((byte)(uVar89 >> 2) & 1);
  auVar100._8_4_ = (uint)bVar15 * 0x219392ef | (uint)!bVar15 * auVar95._8_4_;
  bVar15 = (bool)((byte)(uVar89 >> 3) & 1);
  auVar100._12_4_ = (uint)bVar15 * 0x219392ef | (uint)!bVar15 * auVar95._12_4_;
  auVar100._16_4_ = (uint)((byte)(uVar89 >> 4) & 1) * 0x219392ef;
  auVar100._20_4_ = (uint)((byte)(uVar89 >> 5) & 1) * 0x219392ef;
  auVar100._24_4_ = (uint)((byte)(uVar89 >> 6) & 1) * 0x219392ef;
  auVar100._28_4_ = (uint)(byte)(uVar89 >> 7) * 0x219392ef;
  auVar104 = vandps_avx(ZEXT1632(auVar93),auVar196);
  uVar89 = vcmpps_avx512vl(auVar104,auVar193,1);
  bVar15 = (bool)((byte)uVar89 & 1);
  auVar110._0_4_ = (uint)bVar15 * 0x219392ef | (uint)!bVar15 * auVar93._0_4_;
  bVar15 = (bool)((byte)(uVar89 >> 1) & 1);
  auVar110._4_4_ = (uint)bVar15 * 0x219392ef | (uint)!bVar15 * auVar93._4_4_;
  bVar15 = (bool)((byte)(uVar89 >> 2) & 1);
  auVar110._8_4_ = (uint)bVar15 * 0x219392ef | (uint)!bVar15 * auVar93._8_4_;
  bVar15 = (bool)((byte)(uVar89 >> 3) & 1);
  auVar110._12_4_ = (uint)bVar15 * 0x219392ef | (uint)!bVar15 * auVar93._12_4_;
  auVar110._16_4_ = (uint)((byte)(uVar89 >> 4) & 1) * 0x219392ef;
  auVar110._20_4_ = (uint)((byte)(uVar89 >> 5) & 1) * 0x219392ef;
  auVar110._24_4_ = (uint)((byte)(uVar89 >> 6) & 1) * 0x219392ef;
  auVar110._28_4_ = (uint)(byte)(uVar89 >> 7) * 0x219392ef;
  auVar104 = vandps_avx(ZEXT1632(auVar212),auVar196);
  uVar89 = vcmpps_avx512vl(auVar104,auVar193,1);
  bVar15 = (bool)((byte)uVar89 & 1);
  auVar104._0_4_ = (uint)bVar15 * 0x219392ef | (uint)!bVar15 * auVar212._0_4_;
  bVar15 = (bool)((byte)(uVar89 >> 1) & 1);
  auVar104._4_4_ = (uint)bVar15 * 0x219392ef | (uint)!bVar15 * auVar212._4_4_;
  bVar15 = (bool)((byte)(uVar89 >> 2) & 1);
  auVar104._8_4_ = (uint)bVar15 * 0x219392ef | (uint)!bVar15 * auVar212._8_4_;
  bVar15 = (bool)((byte)(uVar89 >> 3) & 1);
  auVar104._12_4_ = (uint)bVar15 * 0x219392ef | (uint)!bVar15 * auVar212._12_4_;
  auVar104._16_4_ = (uint)((byte)(uVar89 >> 4) & 1) * 0x219392ef;
  auVar104._20_4_ = (uint)((byte)(uVar89 >> 5) & 1) * 0x219392ef;
  auVar104._24_4_ = (uint)((byte)(uVar89 >> 6) & 1) * 0x219392ef;
  auVar104._28_4_ = (uint)(byte)(uVar89 >> 7) * 0x219392ef;
  auVar102 = vrcp14ps_avx512vl(auVar100);
  auVar194._8_4_ = 0x3f800000;
  auVar194._0_8_ = &DAT_3f8000003f800000;
  auVar194._12_4_ = 0x3f800000;
  auVar194._16_4_ = 0x3f800000;
  auVar194._20_4_ = 0x3f800000;
  auVar194._24_4_ = 0x3f800000;
  auVar194._28_4_ = 0x3f800000;
  auVar95 = vfnmadd213ps_fma(auVar100,auVar102,auVar194);
  auVar95 = vfmadd132ps_fma(ZEXT1632(auVar95),auVar102,auVar102);
  auVar102 = vrcp14ps_avx512vl(auVar110);
  auVar93 = vfnmadd213ps_fma(auVar110,auVar102,auVar194);
  auVar93 = vfmadd132ps_fma(ZEXT1632(auVar93),auVar102,auVar102);
  auVar102 = vrcp14ps_avx512vl(auVar104);
  auVar212 = vfnmadd213ps_fma(auVar104,auVar102,auVar194);
  auVar212 = vfmadd132ps_fma(ZEXT1632(auVar212),auVar102,auVar102);
  auVar104 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar86 * 7 + 6));
  auVar104 = vcvtdq2ps_avx(auVar104);
  auVar104 = vsubps_avx(auVar104,ZEXT1632(auVar6));
  auVar113._4_4_ = auVar95._4_4_ * auVar104._4_4_;
  auVar113._0_4_ = auVar95._0_4_ * auVar104._0_4_;
  auVar113._8_4_ = auVar95._8_4_ * auVar104._8_4_;
  auVar113._12_4_ = auVar95._12_4_ * auVar104._12_4_;
  auVar113._16_4_ = auVar104._16_4_ * 0.0;
  auVar113._20_4_ = auVar104._20_4_ * 0.0;
  auVar113._24_4_ = auVar104._24_4_ * 0.0;
  auVar113._28_4_ = auVar104._28_4_;
  auVar104 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar86 * 9 + 6));
  auVar104 = vcvtdq2ps_avx(auVar104);
  auVar104 = vsubps_avx(auVar104,ZEXT1632(auVar6));
  auVar103 = vpbroadcastd_avx512vl();
  auVar102 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + (ulong)(byte)PVar11 * 0x10 + 6));
  auVar169._0_4_ = auVar95._0_4_ * auVar104._0_4_;
  auVar169._4_4_ = auVar95._4_4_ * auVar104._4_4_;
  auVar169._8_4_ = auVar95._8_4_ * auVar104._8_4_;
  auVar169._12_4_ = auVar95._12_4_ * auVar104._12_4_;
  auVar169._16_4_ = auVar104._16_4_ * 0.0;
  auVar169._20_4_ = auVar104._20_4_ * 0.0;
  auVar169._24_4_ = auVar104._24_4_ * 0.0;
  auVar169._28_4_ = 0;
  auVar104 = vpmovsxwd_avx2(*(undefined1 (*) [16])
                             (prim + (ulong)(byte)PVar11 * 0x10 + uVar86 * -2 + 6));
  auVar104 = vcvtdq2ps_avx(auVar104);
  auVar104 = vsubps_avx(auVar104,ZEXT1632(auVar7));
  auVar112._4_4_ = auVar93._4_4_ * auVar104._4_4_;
  auVar112._0_4_ = auVar93._0_4_ * auVar104._0_4_;
  auVar112._8_4_ = auVar93._8_4_ * auVar104._8_4_;
  auVar112._12_4_ = auVar93._12_4_ * auVar104._12_4_;
  auVar112._16_4_ = auVar104._16_4_ * 0.0;
  auVar112._20_4_ = auVar104._20_4_ * 0.0;
  auVar112._24_4_ = auVar104._24_4_ * 0.0;
  auVar112._28_4_ = auVar104._28_4_;
  auVar195 = ZEXT3264(auVar112);
  auVar104 = vcvtdq2ps_avx(auVar102);
  auVar104 = vsubps_avx(auVar104,ZEXT1632(auVar7));
  auVar157._0_4_ = auVar93._0_4_ * auVar104._0_4_;
  auVar157._4_4_ = auVar93._4_4_ * auVar104._4_4_;
  auVar157._8_4_ = auVar93._8_4_ * auVar104._8_4_;
  auVar157._12_4_ = auVar93._12_4_ * auVar104._12_4_;
  auVar157._16_4_ = auVar104._16_4_ * 0.0;
  auVar157._20_4_ = auVar104._20_4_ * 0.0;
  auVar157._24_4_ = auVar104._24_4_ * 0.0;
  auVar157._28_4_ = 0;
  auVar104 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar79 + uVar86 + 6));
  auVar104 = vcvtdq2ps_avx(auVar104);
  auVar104 = vsubps_avx(auVar104,ZEXT1632(auVar8));
  auVar107._4_4_ = auVar104._4_4_ * auVar212._4_4_;
  auVar107._0_4_ = auVar104._0_4_ * auVar212._0_4_;
  auVar107._8_4_ = auVar104._8_4_ * auVar212._8_4_;
  auVar107._12_4_ = auVar104._12_4_ * auVar212._12_4_;
  auVar107._16_4_ = auVar104._16_4_ * 0.0;
  auVar107._20_4_ = auVar104._20_4_ * 0.0;
  auVar107._24_4_ = auVar104._24_4_ * 0.0;
  auVar107._28_4_ = auVar104._28_4_;
  auVar104 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar86 * 0x17 + 6));
  auVar104 = vcvtdq2ps_avx(auVar104);
  auVar104 = vsubps_avx(auVar104,ZEXT1632(auVar8));
  auVar111._0_4_ = auVar212._0_4_ * auVar104._0_4_;
  auVar111._4_4_ = auVar212._4_4_ * auVar104._4_4_;
  auVar111._8_4_ = auVar212._8_4_ * auVar104._8_4_;
  auVar111._12_4_ = auVar212._12_4_ * auVar104._12_4_;
  auVar111._16_4_ = auVar104._16_4_ * 0.0;
  auVar111._20_4_ = auVar104._20_4_ * 0.0;
  auVar111._24_4_ = auVar104._24_4_ * 0.0;
  auVar111._28_4_ = 0;
  auVar104 = vpminsd_avx2(auVar113,auVar169);
  auVar102 = vpminsd_avx2(auVar112,auVar157);
  auVar104 = vmaxps_avx(auVar104,auVar102);
  auVar102 = vpminsd_avx2(auVar107,auVar111);
  uVar148 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 0xc);
  auVar115._4_4_ = uVar148;
  auVar115._0_4_ = uVar148;
  auVar115._8_4_ = uVar148;
  auVar115._12_4_ = uVar148;
  auVar115._16_4_ = uVar148;
  auVar115._20_4_ = uVar148;
  auVar115._24_4_ = uVar148;
  auVar115._28_4_ = uVar148;
  auVar102 = vmaxps_avx512vl(auVar102,auVar115);
  auVar104 = vmaxps_avx(auVar104,auVar102);
  auVar102._8_4_ = 0x3f7ffffa;
  auVar102._0_8_ = 0x3f7ffffa3f7ffffa;
  auVar102._12_4_ = 0x3f7ffffa;
  auVar102._16_4_ = 0x3f7ffffa;
  auVar102._20_4_ = 0x3f7ffffa;
  auVar102._24_4_ = 0x3f7ffffa;
  auVar102._28_4_ = 0x3f7ffffa;
  local_80 = vmulps_avx512vl(auVar104,auVar102);
  auVar178 = ZEXT3264(local_80);
  auVar104 = vpmaxsd_avx2(auVar113,auVar169);
  auVar102 = vpmaxsd_avx2(auVar112,auVar157);
  auVar104 = vminps_avx(auVar104,auVar102);
  auVar102 = vpmaxsd_avx2(auVar107,auVar111);
  fVar171 = (ray->super_RayK<1>).tfar;
  auVar114._4_4_ = fVar171;
  auVar114._0_4_ = fVar171;
  auVar114._8_4_ = fVar171;
  auVar114._12_4_ = fVar171;
  auVar114._16_4_ = fVar171;
  auVar114._20_4_ = fVar171;
  auVar114._24_4_ = fVar171;
  auVar114._28_4_ = fVar171;
  auVar102 = vminps_avx512vl(auVar102,auVar114);
  auVar104 = vminps_avx(auVar104,auVar102);
  auVar105._8_4_ = 0x3f800003;
  auVar105._0_8_ = 0x3f8000033f800003;
  auVar105._12_4_ = 0x3f800003;
  auVar105._16_4_ = 0x3f800003;
  auVar105._20_4_ = 0x3f800003;
  auVar105._24_4_ = 0x3f800003;
  auVar105._28_4_ = 0x3f800003;
  auVar104 = vmulps_avx512vl(auVar104,auVar105);
  uVar22 = vpcmpgtd_avx512vl(auVar103,_DAT_0205a920);
  uVar149 = vcmpps_avx512vl(local_80,auVar104,2);
  if ((byte)((byte)uVar149 & (byte)uVar22) != 0) {
    uVar89 = (ulong)(byte)((byte)uVar149 & (byte)uVar22);
    pPVar87 = prim;
    do {
      local_5a0 = auVar195._0_32_;
      local_600 = auVar178._0_32_;
      local_480 = in_ZMM21._0_32_;
      local_460 = in_ZMM20._0_32_;
      lVar23 = 0;
      for (uVar79 = uVar89; (uVar79 & 1) == 0; uVar79 = uVar79 >> 1 | 0x8000000000000000) {
        lVar23 = lVar23 + 1;
      }
      uVar89 = uVar89 - 1 & uVar89;
      uVar88 = *(uint *)(pPVar87 + lVar23 * 4 + 6);
      uVar79 = (ulong)(uint)((int)lVar23 << 6);
      uVar82 = *(uint *)(pPVar87 + 2);
      local_628 = (ulong)uVar82;
      pGVar13 = (context->scene->geometries).items[uVar82].ptr;
      local_620 = *(undefined1 (*) [16])(prim + uVar79 + lVar71 + 0x16);
      if (uVar89 != 0) {
        uVar84 = uVar89 - 1 & uVar89;
        for (uVar86 = uVar89; (uVar86 & 1) == 0; uVar86 = uVar86 >> 1 | 0x8000000000000000) {
        }
        if (uVar84 != 0) {
          for (; (uVar84 & 1) == 0; uVar84 = uVar84 >> 1 | 0x8000000000000000) {
          }
        }
      }
      local_4d0 = *(undefined1 (*) [16])(prim + uVar79 + lVar71 + 0x26);
      local_4e0 = *(undefined1 (*) [16])(prim + uVar79 + lVar71 + 0x36);
      _local_4f0 = *(undefined1 (*) [16])(prim + uVar79 + lVar71 + 0x46);
      iVar12 = (int)pGVar13[6].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
      aVar3 = (ray->super_RayK<1>).org.field_0;
      auVar93 = vsubps_avx512vl(local_620,(undefined1  [16])aVar3);
      uVar148 = auVar93._0_4_;
      auVar159._4_4_ = uVar148;
      auVar159._0_4_ = uVar148;
      auVar159._8_4_ = uVar148;
      auVar159._12_4_ = uVar148;
      auVar95 = vshufps_avx(auVar93,auVar93,0x55);
      auVar93 = vshufps_avx(auVar93,auVar93,0xaa);
      aVar4 = (pre->ray_space).vx.field_0;
      aVar5 = (pre->ray_space).vy.field_0;
      fVar171 = (pre->ray_space).vz.field_0.m128[0];
      fVar147 = (pre->ray_space).vz.field_0.m128[1];
      fVar184 = (pre->ray_space).vz.field_0.m128[2];
      fVar185 = (pre->ray_space).vz.field_0.m128[3];
      auVar199._0_4_ = auVar93._0_4_ * fVar171;
      auVar199._4_4_ = auVar93._4_4_ * fVar147;
      auVar199._8_4_ = auVar93._8_4_ * fVar184;
      auVar199._12_4_ = auVar93._12_4_ * fVar185;
      auVar95 = vfmadd231ps_fma(auVar199,(undefined1  [16])aVar5,auVar95);
      auVar212 = vfmadd231ps_fma(auVar95,(undefined1  [16])aVar4,auVar159);
      auVar94 = vshufps_avx512vl(local_620,local_620,0xff);
      auVar93 = vsubps_avx(local_4d0,(undefined1  [16])aVar3);
      uVar148 = auVar93._0_4_;
      auVar96._4_4_ = uVar148;
      auVar96._0_4_ = uVar148;
      auVar96._8_4_ = uVar148;
      auVar96._12_4_ = uVar148;
      auVar95 = vshufps_avx(auVar93,auVar93,0x55);
      auVar93 = vshufps_avx(auVar93,auVar93,0xaa);
      auVar200._0_4_ = auVar93._0_4_ * fVar171;
      auVar200._4_4_ = auVar93._4_4_ * fVar147;
      auVar200._8_4_ = auVar93._8_4_ * fVar184;
      auVar200._12_4_ = auVar93._12_4_ * fVar185;
      auVar95 = vfmadd231ps_fma(auVar200,(undefined1  [16])aVar5,auVar95);
      auVar6 = vfmadd231ps_fma(auVar95,(undefined1  [16])aVar4,auVar96);
      auVar93 = vsubps_avx512vl(local_4e0,(undefined1  [16])aVar3);
      uVar148 = auVar93._0_4_;
      auVar97._4_4_ = uVar148;
      auVar97._0_4_ = uVar148;
      auVar97._8_4_ = uVar148;
      auVar97._12_4_ = uVar148;
      auVar95 = vshufps_avx(auVar93,auVar93,0x55);
      auVar93 = vshufps_avx(auVar93,auVar93,0xaa);
      auVar202._0_4_ = auVar93._0_4_ * fVar171;
      auVar202._4_4_ = auVar93._4_4_ * fVar147;
      auVar202._8_4_ = auVar93._8_4_ * fVar184;
      auVar202._12_4_ = auVar93._12_4_ * fVar185;
      auVar95 = vfmadd231ps_fma(auVar202,(undefined1  [16])aVar5,auVar95);
      auVar7 = vfmadd231ps_fma(auVar95,(undefined1  [16])aVar4,auVar97);
      auVar93 = vsubps_avx512vl(_local_4f0,(undefined1  [16])aVar3);
      uVar148 = auVar93._0_4_;
      auVar160._4_4_ = uVar148;
      auVar160._0_4_ = uVar148;
      auVar160._8_4_ = uVar148;
      auVar160._12_4_ = uVar148;
      auVar95 = vshufps_avx(auVar93,auVar93,0x55);
      auVar93 = vshufps_avx(auVar93,auVar93,0xaa);
      auVar98._0_4_ = auVar93._0_4_ * fVar171;
      auVar98._4_4_ = auVar93._4_4_ * fVar147;
      auVar98._8_4_ = auVar93._8_4_ * fVar184;
      auVar98._12_4_ = auVar93._12_4_ * fVar185;
      auVar95 = vfmadd231ps_fma(auVar98,(undefined1  [16])aVar5,auVar95);
      auVar8 = vfmadd231ps_fma(auVar95,(undefined1  [16])aVar4,auVar160);
      lVar23 = (long)iVar12 * 0x44;
      auVar104 = *(undefined1 (*) [32])(bezier_basis0 + lVar23);
      uVar148 = auVar212._0_4_;
      local_420._4_4_ = uVar148;
      local_420._0_4_ = uVar148;
      local_420._8_4_ = uVar148;
      local_420._12_4_ = uVar148;
      local_420._16_4_ = uVar148;
      local_420._20_4_ = uVar148;
      local_420._24_4_ = uVar148;
      local_420._28_4_ = uVar148;
      auVar158._8_4_ = 1;
      auVar158._0_8_ = 0x100000001;
      auVar158._12_4_ = 1;
      auVar158._16_4_ = 1;
      auVar158._20_4_ = 1;
      auVar158._24_4_ = 1;
      auVar158._28_4_ = 1;
      local_520 = vpermps_avx512vl(auVar158,ZEXT1632(auVar212));
      auVar102 = *(undefined1 (*) [32])(bezier_basis0 + lVar23 + 0x484);
      local_540 = vbroadcastss_avx512vl(auVar6);
      local_220 = vpermps_avx2(auVar158,ZEXT1632(auVar6));
      auVar115 = *(undefined1 (*) [32])(bezier_basis0 + lVar23 + 0x908);
      local_a0 = vbroadcastss_avx512vl(auVar7);
      local_c0 = vpermps_avx512vl(auVar158,ZEXT1632(auVar7));
      auVar114 = *(undefined1 (*) [32])(bezier_basis0 + lVar23 + 0xd8c);
      local_4a0 = vbroadcastss_avx512vl(auVar8);
      auVar215 = ZEXT3264(local_4a0);
      local_4c0 = vpermps_avx512vl(auVar158,ZEXT1632(auVar8));
      auVar216 = ZEXT3264(local_4c0);
      auVar105 = vmulps_avx512vl(local_4a0,auVar114);
      auVar103 = vmulps_avx512vl(local_4c0,auVar114);
      auVar105 = vfmadd231ps_avx512vl(auVar105,auVar115,local_a0);
      auVar103 = vfmadd231ps_avx512vl(auVar103,auVar115,local_c0);
      auVar105 = vfmadd231ps_avx512vl(auVar105,auVar102,local_540);
      auVar95 = vfmadd231ps_fma(auVar103,auVar102,local_220);
      auVar101 = vfmadd231ps_avx512vl(auVar105,auVar104,local_420);
      auVar106 = vfmadd231ps_avx512vl(ZEXT1632(auVar95),auVar104,local_520);
      auVar105 = *(undefined1 (*) [32])(bezier_basis1 + lVar23);
      auVar103 = *(undefined1 (*) [32])(bezier_basis1 + lVar23 + 0x484);
      auVar113 = *(undefined1 (*) [32])(bezier_basis1 + lVar23 + 0x908);
      auVar112 = *(undefined1 (*) [32])(bezier_basis1 + lVar23 + 0xd8c);
      auVar107 = vmulps_avx512vl(local_4a0,auVar112);
      auVar108 = vmulps_avx512vl(local_4c0,auVar112);
      auVar107 = vfmadd231ps_avx512vl(auVar107,auVar113,local_a0);
      auVar108 = vfmadd231ps_avx512vl(auVar108,auVar113,local_c0);
      auVar107 = vfmadd231ps_avx512vl(auVar107,auVar103,local_540);
      auVar108 = vfmadd231ps_avx512vl(auVar108,auVar103,local_220);
      auVar9 = vfmadd231ps_fma(auVar107,auVar105,local_420);
      auVar109 = vfmadd231ps_avx512vl(auVar108,auVar105,local_520);
      local_3e0 = vsubps_avx512vl(ZEXT1632(auVar9),auVar101);
      local_3c0 = vsubps_avx(auVar109,auVar106);
      auVar107 = vmulps_avx512vl(auVar106,local_3e0);
      auVar108 = vmulps_avx512vl(auVar101,local_3c0);
      auVar99 = vsubps_avx512vl(auVar107,auVar108);
      auVar95 = vshufps_avx(local_4d0,local_4d0,0xff);
      uVar149 = auVar94._0_8_;
      local_e0._8_8_ = uVar149;
      local_e0._0_8_ = uVar149;
      local_e0._16_8_ = uVar149;
      local_e0._24_8_ = uVar149;
      local_100 = vbroadcastsd_avx512vl(auVar95);
      auVar95 = vshufps_avx512vl(local_4e0,local_4e0,0xff);
      local_120 = vbroadcastsd_avx512vl(auVar95);
      auVar95 = vshufps_avx512vl(_local_4f0,_local_4f0,0xff);
      uVar149 = auVar95._0_8_;
      register0x00001248 = uVar149;
      local_140 = uVar149;
      register0x00001250 = uVar149;
      register0x00001258 = uVar149;
      auVar107 = vmulps_avx512vl(_local_140,auVar114);
      auVar107 = vfmadd231ps_avx512vl(auVar107,auVar115,local_120);
      auVar107 = vfmadd231ps_avx512vl(auVar107,auVar102,local_100);
      auVar100 = vfmadd231ps_avx512vl(auVar107,auVar104,local_e0);
      auVar107 = vmulps_avx512vl(_local_140,auVar112);
      auVar107 = vfmadd231ps_avx512vl(auVar107,auVar113,local_120);
      auVar107 = vfmadd231ps_avx512vl(auVar107,auVar103,local_100);
      auVar94 = vfmadd231ps_fma(auVar107,auVar105,local_e0);
      auVar108 = local_3c0;
      auVar110 = vmulps_avx512vl(local_3c0,local_3c0);
      auVar107 = local_3e0;
      auVar110 = vfmadd231ps_avx512vl(auVar110,local_3e0,local_3e0);
      auVar111 = vmaxps_avx512vl(auVar100,ZEXT1632(auVar94));
      auVar111 = vmulps_avx512vl(auVar111,auVar111);
      auVar110 = vmulps_avx512vl(auVar111,auVar110);
      auVar99 = vmulps_avx512vl(auVar99,auVar99);
      uVar149 = vcmpps_avx512vl(auVar99,auVar110,2);
      auVar95 = vblendps_avx(auVar212,local_620,8);
      auVar96 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
      auVar93 = vandps_avx512vl(auVar95,auVar96);
      auVar160 = local_4d0;
      auVar95 = vblendps_avx(auVar6,local_4d0,8);
      auVar95 = vandps_avx512vl(auVar95,auVar96);
      auVar93 = vmaxps_avx(auVar93,auVar95);
      auVar159 = local_4e0;
      auVar95 = vblendps_avx(auVar7,local_4e0,8);
      auVar97 = vandps_avx512vl(auVar95,auVar96);
      auVar10 = _local_4f0;
      auVar95 = vblendps_avx(auVar8,_local_4f0,8);
      auVar95 = vandps_avx512vl(auVar95,auVar96);
      auVar95 = vmaxps_avx(auVar97,auVar95);
      auVar95 = vmaxps_avx(auVar93,auVar95);
      auVar93 = vmovshdup_avx(auVar95);
      auVar93 = vmaxss_avx(auVar93,auVar95);
      auVar95 = vshufpd_avx(auVar95,auVar95,1);
      auVar95 = vmaxss_avx(auVar95,auVar93);
      _local_3a0 = vcvtsi2ss_avx512f(_local_4f0,iVar12);
      auVar203._0_4_ = local_3a0._0_4_;
      auVar203._4_4_ = auVar203._0_4_;
      auVar203._8_4_ = auVar203._0_4_;
      auVar203._12_4_ = auVar203._0_4_;
      auVar203._16_4_ = auVar203._0_4_;
      auVar203._20_4_ = auVar203._0_4_;
      auVar203._24_4_ = auVar203._0_4_;
      auVar203._28_4_ = auVar203._0_4_;
      uVar22 = vcmpps_avx512vl(auVar203,_DAT_02020f40,0xe);
      bVar90 = (byte)uVar149 & (byte)uVar22;
      auVar95 = vmulss_avx512f(auVar95,ZEXT416(0x35000000));
      auVar176._8_4_ = 2;
      auVar176._0_8_ = 0x200000002;
      auVar176._12_4_ = 2;
      auVar176._16_4_ = 2;
      auVar176._20_4_ = 2;
      auVar176._24_4_ = 2;
      auVar176._28_4_ = 2;
      local_160 = vpermps_avx512vl(auVar176,ZEXT1632(auVar212));
      local_180 = vpermps_avx512vl(auVar176,ZEXT1632(auVar6));
      local_1a0 = vpermps_avx512vl(auVar176,ZEXT1632(auVar7));
      local_1c0 = vpermps_avx2(auVar176,ZEXT1632(auVar8));
      uVar81 = *(uint *)((long)&(ray->super_RayK<1>).org.field_0 + 0xc);
      if (bVar90 == 0) {
        auVar93 = vxorps_avx512vl(_local_4f0,_local_4f0);
        auVar213 = ZEXT1664(auVar93);
        auVar195 = ZEXT3264(local_5a0);
        in_ZMM20 = ZEXT3264(local_460);
        auVar178 = ZEXT3264(local_600);
        in_ZMM21 = ZEXT3264(local_480);
        auVar211 = ZEXT3264(local_420);
        auVar209 = ZEXT3264(local_520);
        auVar210 = ZEXT3264(local_540);
      }
      else {
        local_610 = ZEXT416(uVar81);
        local_400 = auVar95._0_4_;
        uStack_3fc = auVar95._4_4_;
        uStack_3f8 = auVar95._8_4_;
        uStack_3f4 = auVar95._12_4_;
        auVar112 = vmulps_avx512vl(local_1c0,auVar112);
        auVar113 = vfmadd213ps_avx512vl(auVar113,local_1a0,auVar112);
        auVar103 = vfmadd213ps_avx512vl(auVar103,local_180,auVar113);
        auVar103 = vfmadd213ps_avx512vl(auVar105,local_160,auVar103);
        auVar114 = vmulps_avx512vl(local_1c0,auVar114);
        auVar115 = vfmadd213ps_avx512vl(auVar115,local_1a0,auVar114);
        auVar113 = vfmadd213ps_avx512vl(auVar102,local_180,auVar115);
        auVar102 = *(undefined1 (*) [32])(bezier_basis0 + lVar23 + 0x1210);
        auVar115 = *(undefined1 (*) [32])(bezier_basis0 + lVar23 + 0x1694);
        auVar114 = *(undefined1 (*) [32])(bezier_basis0 + lVar23 + 0x1b18);
        auVar105 = *(undefined1 (*) [32])(bezier_basis0 + lVar23 + 0x1f9c);
        auVar113 = vfmadd213ps_avx512vl(auVar104,local_160,auVar113);
        auVar104 = vmulps_avx512vl(local_4a0,auVar105);
        auVar112 = vmulps_avx512vl(local_4c0,auVar105);
        auVar105 = vmulps_avx512vl(local_1c0,auVar105);
        auVar104 = vfmadd231ps_avx512vl(auVar104,auVar114,local_a0);
        auVar112 = vfmadd231ps_avx512vl(auVar112,auVar114,local_c0);
        auVar114 = vfmadd231ps_avx512vl(auVar105,local_1a0,auVar114);
        auVar210 = ZEXT3264(local_540);
        auVar104 = vfmadd231ps_avx512vl(auVar104,auVar115,local_540);
        auVar93 = vfmadd231ps_fma(auVar112,auVar115,local_220);
        auVar105 = vfmadd231ps_avx512vl(auVar114,local_180,auVar115);
        auVar112 = vfmadd231ps_avx512vl(auVar104,auVar102,local_420);
        auVar209 = ZEXT3264(local_520);
        auVar99 = vfmadd231ps_avx512vl(ZEXT1632(auVar93),auVar102,local_520);
        auVar104 = *(undefined1 (*) [32])(bezier_basis1 + lVar23 + 0x1210);
        auVar115 = *(undefined1 (*) [32])(bezier_basis1 + lVar23 + 0x1b18);
        auVar114 = *(undefined1 (*) [32])(bezier_basis1 + lVar23 + 0x1f9c);
        auVar105 = vfmadd231ps_avx512vl(auVar105,local_160,auVar102);
        auVar102 = vmulps_avx512vl(local_4a0,auVar114);
        auVar110 = vmulps_avx512vl(local_4c0,auVar114);
        auVar114 = vmulps_avx512vl(local_1c0,auVar114);
        auVar214 = ZEXT1664(auVar95);
        auVar111 = vfmadd231ps_avx512vl(auVar102,auVar115,local_a0);
        auVar110 = vfmadd231ps_avx512vl(auVar110,auVar115,local_c0);
        auVar115 = vfmadd231ps_avx512vl(auVar114,local_1a0,auVar115);
        auVar102 = *(undefined1 (*) [32])(bezier_basis1 + lVar23 + 0x1694);
        auVar114 = vfmadd231ps_avx512vl(auVar111,auVar102,local_540);
        auVar93 = vfmadd231ps_fma(auVar110,auVar102,local_220);
        auVar102 = vfmadd231ps_avx512vl(auVar115,local_180,auVar102);
        auVar115 = vfmadd231ps_avx512vl(auVar114,auVar104,local_420);
        auVar114 = vfmadd231ps_avx512vl(ZEXT1632(auVar93),auVar104,local_520);
        auVar110 = vfmadd231ps_avx512vl(auVar102,local_160,auVar104);
        auVar207._8_4_ = 0x7fffffff;
        auVar207._0_8_ = 0x7fffffff7fffffff;
        auVar207._12_4_ = 0x7fffffff;
        auVar207._16_4_ = 0x7fffffff;
        auVar207._20_4_ = 0x7fffffff;
        auVar207._24_4_ = 0x7fffffff;
        auVar207._28_4_ = 0x7fffffff;
        auVar104 = vandps_avx(auVar112,auVar207);
        auVar102 = vandps_avx(auVar99,auVar207);
        auVar102 = vmaxps_avx(auVar104,auVar102);
        auVar104 = vandps_avx(auVar105,auVar207);
        auVar104 = vmaxps_avx(auVar102,auVar104);
        auVar105 = vbroadcastss_avx512vl(auVar95);
        uVar79 = vcmpps_avx512vl(auVar104,auVar105,1);
        bVar15 = (bool)((byte)uVar79 & 1);
        auVar116._0_4_ = (float)((uint)bVar15 * local_3e0._0_4_ | (uint)!bVar15 * auVar112._0_4_);
        bVar15 = (bool)((byte)(uVar79 >> 1) & 1);
        auVar116._4_4_ = (float)((uint)bVar15 * local_3e0._4_4_ | (uint)!bVar15 * auVar112._4_4_);
        bVar15 = (bool)((byte)(uVar79 >> 2) & 1);
        auVar116._8_4_ = (float)((uint)bVar15 * local_3e0._8_4_ | (uint)!bVar15 * auVar112._8_4_);
        bVar15 = (bool)((byte)(uVar79 >> 3) & 1);
        auVar116._12_4_ = (float)((uint)bVar15 * local_3e0._12_4_ | (uint)!bVar15 * auVar112._12_4_)
        ;
        bVar15 = (bool)((byte)(uVar79 >> 4) & 1);
        auVar116._16_4_ = (float)((uint)bVar15 * local_3e0._16_4_ | (uint)!bVar15 * auVar112._16_4_)
        ;
        bVar15 = (bool)((byte)(uVar79 >> 5) & 1);
        auVar116._20_4_ = (float)((uint)bVar15 * local_3e0._20_4_ | (uint)!bVar15 * auVar112._20_4_)
        ;
        bVar15 = (bool)((byte)(uVar79 >> 6) & 1);
        auVar116._24_4_ = (float)((uint)bVar15 * local_3e0._24_4_ | (uint)!bVar15 * auVar112._24_4_)
        ;
        bVar15 = SUB81(uVar79 >> 7,0);
        auVar116._28_4_ = (uint)bVar15 * local_3e0._28_4_ | (uint)!bVar15 * auVar112._28_4_;
        bVar15 = (bool)((byte)uVar79 & 1);
        auVar117._0_4_ = (float)((uint)bVar15 * local_3c0._0_4_ | (uint)!bVar15 * auVar99._0_4_);
        bVar15 = (bool)((byte)(uVar79 >> 1) & 1);
        auVar117._4_4_ = (float)((uint)bVar15 * local_3c0._4_4_ | (uint)!bVar15 * auVar99._4_4_);
        bVar15 = (bool)((byte)(uVar79 >> 2) & 1);
        auVar117._8_4_ = (float)((uint)bVar15 * local_3c0._8_4_ | (uint)!bVar15 * auVar99._8_4_);
        bVar15 = (bool)((byte)(uVar79 >> 3) & 1);
        auVar117._12_4_ = (float)((uint)bVar15 * local_3c0._12_4_ | (uint)!bVar15 * auVar99._12_4_);
        bVar15 = (bool)((byte)(uVar79 >> 4) & 1);
        auVar117._16_4_ = (float)((uint)bVar15 * local_3c0._16_4_ | (uint)!bVar15 * auVar99._16_4_);
        bVar15 = (bool)((byte)(uVar79 >> 5) & 1);
        auVar117._20_4_ = (float)((uint)bVar15 * local_3c0._20_4_ | (uint)!bVar15 * auVar99._20_4_);
        bVar15 = (bool)((byte)(uVar79 >> 6) & 1);
        auVar117._24_4_ = (float)((uint)bVar15 * local_3c0._24_4_ | (uint)!bVar15 * auVar99._24_4_);
        bVar15 = SUB81(uVar79 >> 7,0);
        auVar117._28_4_ = (uint)bVar15 * local_3c0._28_4_ | (uint)!bVar15 * auVar99._28_4_;
        auVar104 = vandps_avx(auVar207,auVar115);
        auVar102 = vandps_avx(auVar114,auVar207);
        auVar102 = vmaxps_avx(auVar104,auVar102);
        auVar104 = vandps_avx(auVar110,auVar207);
        auVar104 = vmaxps_avx(auVar102,auVar104);
        uVar79 = vcmpps_avx512vl(auVar104,auVar105,1);
        bVar15 = (bool)((byte)uVar79 & 1);
        auVar118._0_4_ = (float)((uint)bVar15 * local_3e0._0_4_ | (uint)!bVar15 * auVar115._0_4_);
        bVar15 = (bool)((byte)(uVar79 >> 1) & 1);
        auVar118._4_4_ = (float)((uint)bVar15 * local_3e0._4_4_ | (uint)!bVar15 * auVar115._4_4_);
        bVar15 = (bool)((byte)(uVar79 >> 2) & 1);
        auVar118._8_4_ = (float)((uint)bVar15 * local_3e0._8_4_ | (uint)!bVar15 * auVar115._8_4_);
        bVar15 = (bool)((byte)(uVar79 >> 3) & 1);
        auVar118._12_4_ = (float)((uint)bVar15 * local_3e0._12_4_ | (uint)!bVar15 * auVar115._12_4_)
        ;
        bVar15 = (bool)((byte)(uVar79 >> 4) & 1);
        auVar118._16_4_ = (float)((uint)bVar15 * local_3e0._16_4_ | (uint)!bVar15 * auVar115._16_4_)
        ;
        bVar15 = (bool)((byte)(uVar79 >> 5) & 1);
        auVar118._20_4_ = (float)((uint)bVar15 * local_3e0._20_4_ | (uint)!bVar15 * auVar115._20_4_)
        ;
        bVar15 = (bool)((byte)(uVar79 >> 6) & 1);
        auVar118._24_4_ = (float)((uint)bVar15 * local_3e0._24_4_ | (uint)!bVar15 * auVar115._24_4_)
        ;
        bVar15 = SUB81(uVar79 >> 7,0);
        auVar118._28_4_ = (uint)bVar15 * local_3e0._28_4_ | (uint)!bVar15 * auVar115._28_4_;
        bVar15 = (bool)((byte)uVar79 & 1);
        auVar119._0_4_ = (float)((uint)bVar15 * local_3c0._0_4_ | (uint)!bVar15 * auVar114._0_4_);
        bVar15 = (bool)((byte)(uVar79 >> 1) & 1);
        auVar119._4_4_ = (float)((uint)bVar15 * local_3c0._4_4_ | (uint)!bVar15 * auVar114._4_4_);
        bVar15 = (bool)((byte)(uVar79 >> 2) & 1);
        auVar119._8_4_ = (float)((uint)bVar15 * local_3c0._8_4_ | (uint)!bVar15 * auVar114._8_4_);
        bVar15 = (bool)((byte)(uVar79 >> 3) & 1);
        auVar119._12_4_ = (float)((uint)bVar15 * local_3c0._12_4_ | (uint)!bVar15 * auVar114._12_4_)
        ;
        bVar15 = (bool)((byte)(uVar79 >> 4) & 1);
        auVar119._16_4_ = (float)((uint)bVar15 * local_3c0._16_4_ | (uint)!bVar15 * auVar114._16_4_)
        ;
        bVar15 = (bool)((byte)(uVar79 >> 5) & 1);
        auVar119._20_4_ = (float)((uint)bVar15 * local_3c0._20_4_ | (uint)!bVar15 * auVar114._20_4_)
        ;
        bVar15 = (bool)((byte)(uVar79 >> 6) & 1);
        auVar119._24_4_ = (float)((uint)bVar15 * local_3c0._24_4_ | (uint)!bVar15 * auVar114._24_4_)
        ;
        bVar15 = SUB81(uVar79 >> 7,0);
        auVar119._28_4_ = (uint)bVar15 * local_3c0._28_4_ | (uint)!bVar15 * auVar114._28_4_;
        auVar98 = vxorps_avx512vl(_local_4f0,_local_4f0);
        auVar213 = ZEXT1664(auVar98);
        auVar104 = vfmadd213ps_avx512vl(auVar116,auVar116,ZEXT1632(auVar98));
        auVar93 = vfmadd231ps_fma(auVar104,auVar117,auVar117);
        auVar104 = vrsqrt14ps_avx512vl(ZEXT1632(auVar93));
        fVar171 = auVar104._0_4_;
        fVar147 = auVar104._4_4_;
        fVar184 = auVar104._8_4_;
        fVar185 = auVar104._12_4_;
        fVar186 = auVar104._16_4_;
        fVar179 = auVar104._20_4_;
        fVar91 = auVar104._24_4_;
        auVar35._4_4_ = fVar147 * fVar147 * fVar147 * auVar93._4_4_ * -0.5;
        auVar35._0_4_ = fVar171 * fVar171 * fVar171 * auVar93._0_4_ * -0.5;
        auVar35._8_4_ = fVar184 * fVar184 * fVar184 * auVar93._8_4_ * -0.5;
        auVar35._12_4_ = fVar185 * fVar185 * fVar185 * auVar93._12_4_ * -0.5;
        auVar35._16_4_ = fVar186 * fVar186 * fVar186 * -0.0;
        auVar35._20_4_ = fVar179 * fVar179 * fVar179 * -0.0;
        auVar35._24_4_ = fVar91 * fVar91 * fVar91 * -0.0;
        auVar35._28_4_ = 0;
        auVar102 = vbroadcastss_avx512vl(ZEXT416(0x3fc00000));
        auVar115 = vfmadd231ps_avx512vl(auVar35,auVar102,auVar104);
        auVar36._4_4_ = auVar117._4_4_ * auVar115._4_4_;
        auVar36._0_4_ = auVar117._0_4_ * auVar115._0_4_;
        auVar36._8_4_ = auVar117._8_4_ * auVar115._8_4_;
        auVar36._12_4_ = auVar117._12_4_ * auVar115._12_4_;
        auVar36._16_4_ = auVar117._16_4_ * auVar115._16_4_;
        auVar36._20_4_ = auVar117._20_4_ * auVar115._20_4_;
        auVar36._24_4_ = auVar117._24_4_ * auVar115._24_4_;
        auVar36._28_4_ = auVar104._28_4_;
        auVar37._4_4_ = auVar115._4_4_ * -auVar116._4_4_;
        auVar37._0_4_ = auVar115._0_4_ * -auVar116._0_4_;
        auVar37._8_4_ = auVar115._8_4_ * -auVar116._8_4_;
        auVar37._12_4_ = auVar115._12_4_ * -auVar116._12_4_;
        auVar37._16_4_ = auVar115._16_4_ * -auVar116._16_4_;
        auVar37._20_4_ = auVar115._20_4_ * -auVar116._20_4_;
        auVar37._24_4_ = auVar115._24_4_ * -auVar116._24_4_;
        auVar37._28_4_ = auVar116._28_4_ ^ 0x80000000;
        auVar104 = vmulps_avx512vl(auVar115,ZEXT1632(auVar98));
        auVar99 = ZEXT1632(auVar98);
        auVar114 = vfmadd213ps_avx512vl(auVar118,auVar118,auVar99);
        auVar93 = vfmadd231ps_fma(auVar114,auVar119,auVar119);
        auVar114 = vrsqrt14ps_avx512vl(ZEXT1632(auVar93));
        fVar171 = auVar114._0_4_;
        fVar147 = auVar114._4_4_;
        fVar184 = auVar114._8_4_;
        fVar185 = auVar114._12_4_;
        fVar186 = auVar114._16_4_;
        fVar179 = auVar114._20_4_;
        fVar91 = auVar114._24_4_;
        auVar38._4_4_ = fVar147 * fVar147 * fVar147 * auVar93._4_4_ * -0.5;
        auVar38._0_4_ = fVar171 * fVar171 * fVar171 * auVar93._0_4_ * -0.5;
        auVar38._8_4_ = fVar184 * fVar184 * fVar184 * auVar93._8_4_ * -0.5;
        auVar38._12_4_ = fVar185 * fVar185 * fVar185 * auVar93._12_4_ * -0.5;
        auVar38._16_4_ = fVar186 * fVar186 * fVar186 * -0.0;
        auVar38._20_4_ = fVar179 * fVar179 * fVar179 * -0.0;
        auVar38._24_4_ = fVar91 * fVar91 * fVar91 * -0.0;
        auVar38._28_4_ = 0;
        auVar102 = vfmadd231ps_avx512vl(auVar38,auVar102,auVar114);
        auVar39._4_4_ = auVar119._4_4_ * auVar102._4_4_;
        auVar39._0_4_ = auVar119._0_4_ * auVar102._0_4_;
        auVar39._8_4_ = auVar119._8_4_ * auVar102._8_4_;
        auVar39._12_4_ = auVar119._12_4_ * auVar102._12_4_;
        auVar39._16_4_ = auVar119._16_4_ * auVar102._16_4_;
        auVar39._20_4_ = auVar119._20_4_ * auVar102._20_4_;
        auVar39._24_4_ = auVar119._24_4_ * auVar102._24_4_;
        auVar39._28_4_ = auVar114._28_4_;
        auVar40._4_4_ = -auVar118._4_4_ * auVar102._4_4_;
        auVar40._0_4_ = -auVar118._0_4_ * auVar102._0_4_;
        auVar40._8_4_ = -auVar118._8_4_ * auVar102._8_4_;
        auVar40._12_4_ = -auVar118._12_4_ * auVar102._12_4_;
        auVar40._16_4_ = -auVar118._16_4_ * auVar102._16_4_;
        auVar40._20_4_ = -auVar118._20_4_ * auVar102._20_4_;
        auVar40._24_4_ = -auVar118._24_4_ * auVar102._24_4_;
        auVar40._28_4_ = auVar115._28_4_;
        auVar102 = vmulps_avx512vl(auVar102,auVar99);
        auVar93 = vfmadd213ps_fma(auVar36,auVar100,auVar101);
        auVar212 = vfmadd213ps_fma(auVar37,auVar100,auVar106);
        auVar115 = vfmadd213ps_avx512vl(auVar104,auVar100,auVar113);
        auVar114 = vfmadd213ps_avx512vl(auVar39,ZEXT1632(auVar94),ZEXT1632(auVar9));
        auVar96 = vfnmadd213ps_fma(auVar36,auVar100,auVar101);
        auVar112 = ZEXT1632(auVar94);
        auVar6 = vfmadd213ps_fma(auVar40,auVar112,auVar109);
        auVar97 = vfnmadd213ps_fma(auVar37,auVar100,auVar106);
        auVar7 = vfmadd213ps_fma(auVar102,auVar112,auVar103);
        auVar105 = vfnmadd231ps_avx512vl(auVar113,auVar100,auVar104);
        auVar199 = vfnmadd213ps_fma(auVar39,auVar112,ZEXT1632(auVar9));
        auVar200 = vfnmadd213ps_fma(auVar40,auVar112,auVar109);
        auVar202 = vfnmadd231ps_fma(auVar103,ZEXT1632(auVar94),auVar102);
        auVar102 = vsubps_avx512vl(auVar114,ZEXT1632(auVar96));
        auVar104 = vsubps_avx(ZEXT1632(auVar6),ZEXT1632(auVar97));
        auVar103 = vsubps_avx512vl(ZEXT1632(auVar7),auVar105);
        auVar113 = vmulps_avx512vl(auVar104,auVar105);
        auVar8 = vfmsub231ps_fma(auVar113,ZEXT1632(auVar97),auVar103);
        auVar41._4_4_ = auVar96._4_4_ * auVar103._4_4_;
        auVar41._0_4_ = auVar96._0_4_ * auVar103._0_4_;
        auVar41._8_4_ = auVar96._8_4_ * auVar103._8_4_;
        auVar41._12_4_ = auVar96._12_4_ * auVar103._12_4_;
        auVar41._16_4_ = auVar103._16_4_ * 0.0;
        auVar41._20_4_ = auVar103._20_4_ * 0.0;
        auVar41._24_4_ = auVar103._24_4_ * 0.0;
        auVar41._28_4_ = auVar103._28_4_;
        auVar103 = vfmsub231ps_avx512vl(auVar41,auVar105,auVar102);
        auVar42._4_4_ = auVar97._4_4_ * auVar102._4_4_;
        auVar42._0_4_ = auVar97._0_4_ * auVar102._0_4_;
        auVar42._8_4_ = auVar97._8_4_ * auVar102._8_4_;
        auVar42._12_4_ = auVar97._12_4_ * auVar102._12_4_;
        auVar42._16_4_ = auVar102._16_4_ * 0.0;
        auVar42._20_4_ = auVar102._20_4_ * 0.0;
        auVar42._24_4_ = auVar102._24_4_ * 0.0;
        auVar42._28_4_ = auVar102._28_4_;
        auVar9 = vfmsub231ps_fma(auVar42,ZEXT1632(auVar96),auVar104);
        auVar104 = vfmadd231ps_avx512vl(ZEXT1632(auVar9),auVar99,auVar103);
        auVar104 = vfmadd231ps_avx512vl(auVar104,auVar99,ZEXT1632(auVar8));
        auVar99 = ZEXT1632(auVar98);
        uVar79 = vcmpps_avx512vl(auVar104,auVar99,2);
        bVar78 = (byte)uVar79;
        fVar91 = (float)((uint)(bVar78 & 1) * auVar93._0_4_ |
                        (uint)!(bool)(bVar78 & 1) * auVar199._0_4_);
        bVar15 = (bool)((byte)(uVar79 >> 1) & 1);
        fVar170 = (float)((uint)bVar15 * auVar93._4_4_ | (uint)!bVar15 * auVar199._4_4_);
        bVar15 = (bool)((byte)(uVar79 >> 2) & 1);
        fVar140 = (float)((uint)bVar15 * auVar93._8_4_ | (uint)!bVar15 * auVar199._8_4_);
        bVar15 = (bool)((byte)(uVar79 >> 3) & 1);
        fVar143 = (float)((uint)bVar15 * auVar93._12_4_ | (uint)!bVar15 * auVar199._12_4_);
        auVar113 = ZEXT1632(CONCAT412(fVar143,CONCAT48(fVar140,CONCAT44(fVar170,fVar91))));
        fVar92 = (float)((uint)(bVar78 & 1) * auVar212._0_4_ |
                        (uint)!(bool)(bVar78 & 1) * auVar200._0_4_);
        bVar15 = (bool)((byte)(uVar79 >> 1) & 1);
        fVar139 = (float)((uint)bVar15 * auVar212._4_4_ | (uint)!bVar15 * auVar200._4_4_);
        bVar15 = (bool)((byte)(uVar79 >> 2) & 1);
        fVar141 = (float)((uint)bVar15 * auVar212._8_4_ | (uint)!bVar15 * auVar200._8_4_);
        bVar15 = (bool)((byte)(uVar79 >> 3) & 1);
        fVar144 = (float)((uint)bVar15 * auVar212._12_4_ | (uint)!bVar15 * auVar200._12_4_);
        auVar112 = ZEXT1632(CONCAT412(fVar144,CONCAT48(fVar141,CONCAT44(fVar139,fVar92))));
        auVar120._0_4_ =
             (float)((uint)(bVar78 & 1) * auVar115._0_4_ |
                    (uint)!(bool)(bVar78 & 1) * auVar202._0_4_);
        bVar15 = (bool)((byte)(uVar79 >> 1) & 1);
        auVar120._4_4_ = (float)((uint)bVar15 * auVar115._4_4_ | (uint)!bVar15 * auVar202._4_4_);
        bVar15 = (bool)((byte)(uVar79 >> 2) & 1);
        auVar120._8_4_ = (float)((uint)bVar15 * auVar115._8_4_ | (uint)!bVar15 * auVar202._8_4_);
        bVar15 = (bool)((byte)(uVar79 >> 3) & 1);
        auVar120._12_4_ = (float)((uint)bVar15 * auVar115._12_4_ | (uint)!bVar15 * auVar202._12_4_);
        fVar171 = (float)((uint)((byte)(uVar79 >> 4) & 1) * auVar115._16_4_);
        auVar120._16_4_ = fVar171;
        fVar147 = (float)((uint)((byte)(uVar79 >> 5) & 1) * auVar115._20_4_);
        auVar120._20_4_ = fVar147;
        fVar184 = (float)((uint)((byte)(uVar79 >> 6) & 1) * auVar115._24_4_);
        auVar120._24_4_ = fVar184;
        iVar1 = (uint)(byte)(uVar79 >> 7) * auVar115._28_4_;
        auVar120._28_4_ = iVar1;
        auVar102 = vblendmps_avx512vl(ZEXT1632(auVar96),auVar114);
        auVar121._0_4_ =
             (uint)(bVar78 & 1) * auVar102._0_4_ | (uint)!(bool)(bVar78 & 1) * auVar8._0_4_;
        bVar15 = (bool)((byte)(uVar79 >> 1) & 1);
        auVar121._4_4_ = (uint)bVar15 * auVar102._4_4_ | (uint)!bVar15 * auVar8._4_4_;
        bVar15 = (bool)((byte)(uVar79 >> 2) & 1);
        auVar121._8_4_ = (uint)bVar15 * auVar102._8_4_ | (uint)!bVar15 * auVar8._8_4_;
        bVar15 = (bool)((byte)(uVar79 >> 3) & 1);
        auVar121._12_4_ = (uint)bVar15 * auVar102._12_4_ | (uint)!bVar15 * auVar8._12_4_;
        auVar121._16_4_ = (uint)((byte)(uVar79 >> 4) & 1) * auVar102._16_4_;
        auVar121._20_4_ = (uint)((byte)(uVar79 >> 5) & 1) * auVar102._20_4_;
        auVar121._24_4_ = (uint)((byte)(uVar79 >> 6) & 1) * auVar102._24_4_;
        auVar121._28_4_ = (uint)(byte)(uVar79 >> 7) * auVar102._28_4_;
        auVar102 = vblendmps_avx512vl(ZEXT1632(auVar97),ZEXT1632(auVar6));
        auVar122._0_4_ =
             (float)((uint)(bVar78 & 1) * auVar102._0_4_ |
                    (uint)!(bool)(bVar78 & 1) * auVar212._0_4_);
        bVar15 = (bool)((byte)(uVar79 >> 1) & 1);
        auVar122._4_4_ = (float)((uint)bVar15 * auVar102._4_4_ | (uint)!bVar15 * auVar212._4_4_);
        bVar15 = (bool)((byte)(uVar79 >> 2) & 1);
        auVar122._8_4_ = (float)((uint)bVar15 * auVar102._8_4_ | (uint)!bVar15 * auVar212._8_4_);
        bVar15 = (bool)((byte)(uVar79 >> 3) & 1);
        auVar122._12_4_ = (float)((uint)bVar15 * auVar102._12_4_ | (uint)!bVar15 * auVar212._12_4_);
        fVar185 = (float)((uint)((byte)(uVar79 >> 4) & 1) * auVar102._16_4_);
        auVar122._16_4_ = fVar185;
        fVar186 = (float)((uint)((byte)(uVar79 >> 5) & 1) * auVar102._20_4_);
        auVar122._20_4_ = fVar186;
        fVar179 = (float)((uint)((byte)(uVar79 >> 6) & 1) * auVar102._24_4_);
        auVar122._24_4_ = fVar179;
        auVar122._28_4_ = (uint)(byte)(uVar79 >> 7) * auVar102._28_4_;
        auVar102 = vblendmps_avx512vl(auVar105,ZEXT1632(auVar7));
        auVar123._0_4_ =
             (float)((uint)(bVar78 & 1) * auVar102._0_4_ |
                    (uint)!(bool)(bVar78 & 1) * auVar115._0_4_);
        bVar15 = (bool)((byte)(uVar79 >> 1) & 1);
        auVar123._4_4_ = (float)((uint)bVar15 * auVar102._4_4_ | (uint)!bVar15 * auVar115._4_4_);
        bVar15 = (bool)((byte)(uVar79 >> 2) & 1);
        auVar123._8_4_ = (float)((uint)bVar15 * auVar102._8_4_ | (uint)!bVar15 * auVar115._8_4_);
        bVar15 = (bool)((byte)(uVar79 >> 3) & 1);
        auVar123._12_4_ = (float)((uint)bVar15 * auVar102._12_4_ | (uint)!bVar15 * auVar115._12_4_);
        bVar15 = (bool)((byte)(uVar79 >> 4) & 1);
        auVar123._16_4_ = (float)((uint)bVar15 * auVar102._16_4_ | (uint)!bVar15 * auVar115._16_4_);
        bVar15 = (bool)((byte)(uVar79 >> 5) & 1);
        auVar123._20_4_ = (float)((uint)bVar15 * auVar102._20_4_ | (uint)!bVar15 * auVar115._20_4_);
        bVar15 = (bool)((byte)(uVar79 >> 6) & 1);
        auVar123._24_4_ = (float)((uint)bVar15 * auVar102._24_4_ | (uint)!bVar15 * auVar115._24_4_);
        bVar15 = SUB81(uVar79 >> 7,0);
        auVar123._28_4_ = (uint)bVar15 * auVar102._28_4_ | (uint)!bVar15 * auVar115._28_4_;
        auVar124._0_4_ =
             (uint)(bVar78 & 1) * (int)auVar96._0_4_ | (uint)!(bool)(bVar78 & 1) * auVar114._0_4_;
        bVar15 = (bool)((byte)(uVar79 >> 1) & 1);
        auVar124._4_4_ = (uint)bVar15 * (int)auVar96._4_4_ | (uint)!bVar15 * auVar114._4_4_;
        bVar15 = (bool)((byte)(uVar79 >> 2) & 1);
        auVar124._8_4_ = (uint)bVar15 * (int)auVar96._8_4_ | (uint)!bVar15 * auVar114._8_4_;
        bVar15 = (bool)((byte)(uVar79 >> 3) & 1);
        auVar124._12_4_ = (uint)bVar15 * (int)auVar96._12_4_ | (uint)!bVar15 * auVar114._12_4_;
        auVar124._16_4_ = (uint)!(bool)((byte)(uVar79 >> 4) & 1) * auVar114._16_4_;
        auVar124._20_4_ = (uint)!(bool)((byte)(uVar79 >> 5) & 1) * auVar114._20_4_;
        auVar124._24_4_ = (uint)!(bool)((byte)(uVar79 >> 6) & 1) * auVar114._24_4_;
        auVar124._28_4_ = (uint)!SUB81(uVar79 >> 7,0) * auVar114._28_4_;
        bVar15 = (bool)((byte)(uVar79 >> 1) & 1);
        bVar17 = (bool)((byte)(uVar79 >> 2) & 1);
        bVar18 = (bool)((byte)(uVar79 >> 3) & 1);
        auVar125._0_4_ =
             (uint)(bVar78 & 1) * auVar105._0_4_ | (uint)!(bool)(bVar78 & 1) * auVar7._0_4_;
        bVar16 = (bool)((byte)(uVar79 >> 1) & 1);
        auVar125._4_4_ = (uint)bVar16 * auVar105._4_4_ | (uint)!bVar16 * auVar7._4_4_;
        bVar16 = (bool)((byte)(uVar79 >> 2) & 1);
        auVar125._8_4_ = (uint)bVar16 * auVar105._8_4_ | (uint)!bVar16 * auVar7._8_4_;
        bVar16 = (bool)((byte)(uVar79 >> 3) & 1);
        auVar125._12_4_ = (uint)bVar16 * auVar105._12_4_ | (uint)!bVar16 * auVar7._12_4_;
        auVar125._16_4_ = (uint)((byte)(uVar79 >> 4) & 1) * auVar105._16_4_;
        auVar125._20_4_ = (uint)((byte)(uVar79 >> 5) & 1) * auVar105._20_4_;
        auVar125._24_4_ = (uint)((byte)(uVar79 >> 6) & 1) * auVar105._24_4_;
        iVar2 = (uint)(byte)(uVar79 >> 7) * auVar105._28_4_;
        auVar125._28_4_ = iVar2;
        auVar101 = vsubps_avx512vl(auVar124,auVar113);
        auVar102 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar18 * (int)auVar97._12_4_ |
                                                 (uint)!bVar18 * auVar6._12_4_,
                                                 CONCAT48((uint)bVar17 * (int)auVar97._8_4_ |
                                                          (uint)!bVar17 * auVar6._8_4_,
                                                          CONCAT44((uint)bVar15 * (int)auVar97._4_4_
                                                                   | (uint)!bVar15 * auVar6._4_4_,
                                                                   (uint)(bVar78 & 1) *
                                                                   (int)auVar97._0_4_ |
                                                                   (uint)!(bool)(bVar78 & 1) *
                                                                   auVar6._0_4_)))),auVar112);
        auVar115 = vsubps_avx(auVar125,auVar120);
        auVar114 = vsubps_avx(auVar113,auVar121);
        auVar105 = vsubps_avx(auVar112,auVar122);
        auVar103 = vsubps_avx(auVar120,auVar123);
        auVar43._4_4_ = auVar115._4_4_ * fVar170;
        auVar43._0_4_ = auVar115._0_4_ * fVar91;
        auVar43._8_4_ = auVar115._8_4_ * fVar140;
        auVar43._12_4_ = auVar115._12_4_ * fVar143;
        auVar43._16_4_ = auVar115._16_4_ * 0.0;
        auVar43._20_4_ = auVar115._20_4_ * 0.0;
        auVar43._24_4_ = auVar115._24_4_ * 0.0;
        auVar43._28_4_ = iVar2;
        auVar93 = vfmsub231ps_fma(auVar43,auVar120,auVar101);
        auVar44._4_4_ = fVar139 * auVar101._4_4_;
        auVar44._0_4_ = fVar92 * auVar101._0_4_;
        auVar44._8_4_ = fVar141 * auVar101._8_4_;
        auVar44._12_4_ = fVar144 * auVar101._12_4_;
        auVar44._16_4_ = auVar101._16_4_ * 0.0;
        auVar44._20_4_ = auVar101._20_4_ * 0.0;
        auVar44._24_4_ = auVar101._24_4_ * 0.0;
        auVar44._28_4_ = auVar104._28_4_;
        auVar212 = vfmsub231ps_fma(auVar44,auVar113,auVar102);
        auVar104 = vfmadd231ps_avx512vl(ZEXT1632(auVar212),auVar99,ZEXT1632(auVar93));
        auVar180._0_4_ = auVar102._0_4_ * auVar120._0_4_;
        auVar180._4_4_ = auVar102._4_4_ * auVar120._4_4_;
        auVar180._8_4_ = auVar102._8_4_ * auVar120._8_4_;
        auVar180._12_4_ = auVar102._12_4_ * auVar120._12_4_;
        auVar180._16_4_ = auVar102._16_4_ * fVar171;
        auVar180._20_4_ = auVar102._20_4_ * fVar147;
        auVar180._24_4_ = auVar102._24_4_ * fVar184;
        auVar180._28_4_ = 0;
        auVar93 = vfmsub231ps_fma(auVar180,auVar112,auVar115);
        auVar106 = vfmadd231ps_avx512vl(auVar104,auVar99,ZEXT1632(auVar93));
        auVar104 = vmulps_avx512vl(auVar103,auVar121);
        auVar104 = vfmsub231ps_avx512vl(auVar104,auVar114,auVar123);
        auVar45._4_4_ = auVar105._4_4_ * auVar123._4_4_;
        auVar45._0_4_ = auVar105._0_4_ * auVar123._0_4_;
        auVar45._8_4_ = auVar105._8_4_ * auVar123._8_4_;
        auVar45._12_4_ = auVar105._12_4_ * auVar123._12_4_;
        auVar45._16_4_ = auVar105._16_4_ * auVar123._16_4_;
        auVar45._20_4_ = auVar105._20_4_ * auVar123._20_4_;
        auVar45._24_4_ = auVar105._24_4_ * auVar123._24_4_;
        auVar45._28_4_ = auVar123._28_4_;
        auVar93 = vfmsub231ps_fma(auVar45,auVar122,auVar103);
        auVar181._0_4_ = auVar122._0_4_ * auVar114._0_4_;
        auVar181._4_4_ = auVar122._4_4_ * auVar114._4_4_;
        auVar181._8_4_ = auVar122._8_4_ * auVar114._8_4_;
        auVar181._12_4_ = auVar122._12_4_ * auVar114._12_4_;
        auVar181._16_4_ = fVar185 * auVar114._16_4_;
        auVar181._20_4_ = fVar186 * auVar114._20_4_;
        auVar181._24_4_ = fVar179 * auVar114._24_4_;
        auVar181._28_4_ = 0;
        auVar212 = vfmsub231ps_fma(auVar181,auVar105,auVar121);
        auVar104 = vfmadd231ps_avx512vl(ZEXT1632(auVar212),auVar99,auVar104);
        auVar109 = vfmadd231ps_avx512vl(auVar104,auVar99,ZEXT1632(auVar93));
        auVar104 = vmaxps_avx(auVar106,auVar109);
        uVar149 = vcmpps_avx512vl(auVar104,auVar99,2);
        bVar90 = bVar90 & (byte)uVar149;
        in_ZMM20 = ZEXT3264(local_460);
        in_ZMM21 = ZEXT3264(local_480);
        auVar211 = ZEXT3264(local_420);
        if (bVar90 == 0) {
          bVar90 = 0;
          auVar195 = ZEXT3264(local_5a0);
          auVar178 = ZEXT3264(local_600);
        }
        else {
          auVar46._4_4_ = auVar103._4_4_ * auVar102._4_4_;
          auVar46._0_4_ = auVar103._0_4_ * auVar102._0_4_;
          auVar46._8_4_ = auVar103._8_4_ * auVar102._8_4_;
          auVar46._12_4_ = auVar103._12_4_ * auVar102._12_4_;
          auVar46._16_4_ = auVar103._16_4_ * auVar102._16_4_;
          auVar46._20_4_ = auVar103._20_4_ * auVar102._20_4_;
          auVar46._24_4_ = auVar103._24_4_ * auVar102._24_4_;
          auVar46._28_4_ = auVar104._28_4_;
          auVar6 = vfmsub231ps_fma(auVar46,auVar105,auVar115);
          auVar47._4_4_ = auVar115._4_4_ * auVar114._4_4_;
          auVar47._0_4_ = auVar115._0_4_ * auVar114._0_4_;
          auVar47._8_4_ = auVar115._8_4_ * auVar114._8_4_;
          auVar47._12_4_ = auVar115._12_4_ * auVar114._12_4_;
          auVar47._16_4_ = auVar115._16_4_ * auVar114._16_4_;
          auVar47._20_4_ = auVar115._20_4_ * auVar114._20_4_;
          auVar47._24_4_ = auVar115._24_4_ * auVar114._24_4_;
          auVar47._28_4_ = auVar115._28_4_;
          auVar212 = vfmsub231ps_fma(auVar47,auVar101,auVar103);
          auVar48._4_4_ = auVar105._4_4_ * auVar101._4_4_;
          auVar48._0_4_ = auVar105._0_4_ * auVar101._0_4_;
          auVar48._8_4_ = auVar105._8_4_ * auVar101._8_4_;
          auVar48._12_4_ = auVar105._12_4_ * auVar101._12_4_;
          auVar48._16_4_ = auVar105._16_4_ * auVar101._16_4_;
          auVar48._20_4_ = auVar105._20_4_ * auVar101._20_4_;
          auVar48._24_4_ = auVar105._24_4_ * auVar101._24_4_;
          auVar48._28_4_ = auVar105._28_4_;
          auVar7 = vfmsub231ps_fma(auVar48,auVar114,auVar102);
          auVar93 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar212),ZEXT1632(auVar7));
          auVar104 = vfmadd231ps_avx512vl(ZEXT1632(auVar93),ZEXT1632(auVar6),auVar99);
          auVar102 = vrcp14ps_avx512vl(auVar104);
          auVar24._8_4_ = 0x3f800000;
          auVar24._0_8_ = &DAT_3f8000003f800000;
          auVar24._12_4_ = 0x3f800000;
          auVar24._16_4_ = 0x3f800000;
          auVar24._20_4_ = 0x3f800000;
          auVar24._24_4_ = 0x3f800000;
          auVar24._28_4_ = 0x3f800000;
          auVar115 = vfnmadd213ps_avx512vl(auVar102,auVar104,auVar24);
          auVar93 = vfmadd132ps_fma(auVar115,auVar102,auVar102);
          auVar49._4_4_ = auVar7._4_4_ * auVar120._4_4_;
          auVar49._0_4_ = auVar7._0_4_ * auVar120._0_4_;
          auVar49._8_4_ = auVar7._8_4_ * auVar120._8_4_;
          auVar49._12_4_ = auVar7._12_4_ * auVar120._12_4_;
          auVar49._16_4_ = fVar171 * 0.0;
          auVar49._20_4_ = fVar147 * 0.0;
          auVar49._24_4_ = fVar184 * 0.0;
          auVar49._28_4_ = iVar1;
          auVar212 = vfmadd231ps_fma(auVar49,auVar112,ZEXT1632(auVar212));
          auVar212 = vfmadd231ps_fma(ZEXT1632(auVar212),auVar113,ZEXT1632(auVar6));
          fVar147 = auVar93._0_4_;
          fVar184 = auVar93._4_4_;
          fVar185 = auVar93._8_4_;
          fVar186 = auVar93._12_4_;
          auVar102 = ZEXT1632(CONCAT412(auVar212._12_4_ * fVar186,
                                        CONCAT48(auVar212._8_4_ * fVar185,
                                                 CONCAT44(auVar212._4_4_ * fVar184,
                                                          auVar212._0_4_ * fVar147))));
          auVar197._4_4_ = uVar81;
          auVar197._0_4_ = uVar81;
          auVar197._8_4_ = uVar81;
          auVar197._12_4_ = uVar81;
          auVar197._16_4_ = uVar81;
          auVar197._20_4_ = uVar81;
          auVar197._24_4_ = uVar81;
          auVar197._28_4_ = uVar81;
          uVar149 = vcmpps_avx512vl(auVar197,auVar102,2);
          fVar171 = (ray->super_RayK<1>).tfar;
          auVar25._4_4_ = fVar171;
          auVar25._0_4_ = fVar171;
          auVar25._8_4_ = fVar171;
          auVar25._12_4_ = fVar171;
          auVar25._16_4_ = fVar171;
          auVar25._20_4_ = fVar171;
          auVar25._24_4_ = fVar171;
          auVar25._28_4_ = fVar171;
          uVar22 = vcmpps_avx512vl(auVar102,auVar25,2);
          bVar90 = (byte)uVar149 & (byte)uVar22 & bVar90;
          if (bVar90 == 0) {
            bVar90 = 0;
            auVar195 = ZEXT3264(local_5a0);
            auVar178 = ZEXT3264(local_600);
          }
          else {
            uVar149 = vcmpps_avx512vl(auVar104,auVar99,4);
            if ((bVar90 & (byte)uVar149) == 0) {
              bVar90 = 0;
              auVar195 = ZEXT3264(local_5a0);
              auVar178 = ZEXT3264(local_600);
            }
            else {
              bVar90 = bVar90 & (byte)uVar149;
              fVar171 = auVar106._0_4_ * fVar147;
              fVar179 = auVar106._4_4_ * fVar184;
              auVar50._4_4_ = fVar179;
              auVar50._0_4_ = fVar171;
              fVar91 = auVar106._8_4_ * fVar185;
              auVar50._8_4_ = fVar91;
              fVar92 = auVar106._12_4_ * fVar186;
              auVar50._12_4_ = fVar92;
              fVar170 = auVar106._16_4_ * 0.0;
              auVar50._16_4_ = fVar170;
              fVar139 = auVar106._20_4_ * 0.0;
              auVar50._20_4_ = fVar139;
              fVar140 = auVar106._24_4_ * 0.0;
              auVar50._24_4_ = fVar140;
              auVar50._28_4_ = auVar106._28_4_;
              fVar147 = auVar109._0_4_ * fVar147;
              fVar184 = auVar109._4_4_ * fVar184;
              auVar51._4_4_ = fVar184;
              auVar51._0_4_ = fVar147;
              fVar185 = auVar109._8_4_ * fVar185;
              auVar51._8_4_ = fVar185;
              fVar186 = auVar109._12_4_ * fVar186;
              auVar51._12_4_ = fVar186;
              fVar141 = auVar109._16_4_ * 0.0;
              auVar51._16_4_ = fVar141;
              fVar143 = auVar109._20_4_ * 0.0;
              auVar51._20_4_ = fVar143;
              fVar144 = auVar109._24_4_ * 0.0;
              auVar51._24_4_ = fVar144;
              auVar51._28_4_ = auVar109._28_4_;
              auVar191._8_4_ = 0x3f800000;
              auVar191._0_8_ = &DAT_3f8000003f800000;
              auVar191._12_4_ = 0x3f800000;
              auVar191._16_4_ = 0x3f800000;
              auVar191._20_4_ = 0x3f800000;
              auVar191._24_4_ = 0x3f800000;
              auVar191._28_4_ = 0x3f800000;
              auVar104 = vsubps_avx(auVar191,auVar50);
              bVar15 = (bool)((byte)(uVar79 >> 1) & 1);
              bVar16 = (bool)((byte)(uVar79 >> 2) & 1);
              bVar17 = (bool)((byte)(uVar79 >> 3) & 1);
              bVar18 = (bool)((byte)(uVar79 >> 4) & 1);
              bVar19 = (bool)((byte)(uVar79 >> 5) & 1);
              bVar20 = (bool)((byte)(uVar79 >> 6) & 1);
              bVar21 = SUB81(uVar79 >> 7,0);
              auVar195 = ZEXT3264(CONCAT428((uint)bVar21 * auVar106._28_4_ |
                                            (uint)!bVar21 * auVar104._28_4_,
                                            CONCAT424((uint)bVar20 * (int)fVar140 |
                                                      (uint)!bVar20 * auVar104._24_4_,
                                                      CONCAT420((uint)bVar19 * (int)fVar139 |
                                                                (uint)!bVar19 * auVar104._20_4_,
                                                                CONCAT416((uint)bVar18 *
                                                                          (int)fVar170 |
                                                                          (uint)!bVar18 *
                                                                          auVar104._16_4_,
                                                                          CONCAT412((uint)bVar17 *
                                                                                    (int)fVar92 |
                                                                                    (uint)!bVar17 *
                                                                                    auVar104._12_4_,
                                                                                    CONCAT48((uint)
                                                  bVar16 * (int)fVar91 |
                                                  (uint)!bVar16 * auVar104._8_4_,
                                                  CONCAT44((uint)bVar15 * (int)fVar179 |
                                                           (uint)!bVar15 * auVar104._4_4_,
                                                           (uint)(bVar78 & 1) * (int)fVar171 |
                                                           (uint)!(bool)(bVar78 & 1) *
                                                           auVar104._0_4_))))))));
              auVar104 = vsubps_avx(auVar191,auVar51);
              bVar15 = (bool)((byte)(uVar79 >> 1) & 1);
              bVar16 = (bool)((byte)(uVar79 >> 2) & 1);
              bVar17 = (bool)((byte)(uVar79 >> 3) & 1);
              bVar18 = (bool)((byte)(uVar79 >> 4) & 1);
              bVar19 = (bool)((byte)(uVar79 >> 5) & 1);
              bVar20 = (bool)((byte)(uVar79 >> 6) & 1);
              bVar21 = SUB81(uVar79 >> 7,0);
              local_240._4_4_ = (uint)bVar15 * (int)fVar184 | (uint)!bVar15 * auVar104._4_4_;
              local_240._0_4_ =
                   (uint)(bVar78 & 1) * (int)fVar147 | (uint)!(bool)(bVar78 & 1) * auVar104._0_4_;
              local_240._8_4_ = (uint)bVar16 * (int)fVar185 | (uint)!bVar16 * auVar104._8_4_;
              local_240._12_4_ = (uint)bVar17 * (int)fVar186 | (uint)!bVar17 * auVar104._12_4_;
              local_240._16_4_ = (uint)bVar18 * (int)fVar141 | (uint)!bVar18 * auVar104._16_4_;
              local_240._20_4_ = (uint)bVar19 * (int)fVar143 | (uint)!bVar19 * auVar104._20_4_;
              local_240._24_4_ = (uint)bVar20 * (int)fVar144 | (uint)!bVar20 * auVar104._24_4_;
              local_240._28_4_ = (uint)bVar21 * auVar109._28_4_ | (uint)!bVar21 * auVar104._28_4_;
              auVar178 = ZEXT3264(auVar102);
            }
          }
        }
        auVar216 = ZEXT3264(local_4c0);
        auVar215 = ZEXT3264(local_4a0);
        auVar198 = ZEXT1664(local_620);
        if (bVar90 != 0) {
          auVar104 = vsubps_avx(ZEXT1632(auVar94),auVar100);
          local_380 = auVar195._0_32_;
          auVar93 = vfmadd213ps_fma(auVar104,local_380,auVar100);
          fVar171 = pre->depth_scale;
          auVar26._4_4_ = fVar171;
          auVar26._0_4_ = fVar171;
          auVar26._8_4_ = fVar171;
          auVar26._12_4_ = fVar171;
          auVar26._16_4_ = fVar171;
          auVar26._20_4_ = fVar171;
          auVar26._24_4_ = fVar171;
          auVar26._28_4_ = fVar171;
          auVar104 = vmulps_avx512vl(ZEXT1632(CONCAT412(auVar93._12_4_ + auVar93._12_4_,
                                                        CONCAT48(auVar93._8_4_ + auVar93._8_4_,
                                                                 CONCAT44(auVar93._4_4_ +
                                                                          auVar93._4_4_,
                                                                          auVar93._0_4_ +
                                                                          auVar93._0_4_)))),auVar26)
          ;
          local_340 = auVar178._0_32_;
          uVar149 = vcmpps_avx512vl(local_340,auVar104,6);
          bVar90 = bVar90 & (byte)uVar149;
          if (bVar90 != 0) {
            auVar150._8_4_ = 0xbf800000;
            auVar150._0_8_ = 0xbf800000bf800000;
            auVar150._12_4_ = 0xbf800000;
            auVar150._16_4_ = 0xbf800000;
            auVar150._20_4_ = 0xbf800000;
            auVar150._24_4_ = 0xbf800000;
            auVar150._28_4_ = 0xbf800000;
            auVar27._8_4_ = 0x40000000;
            auVar27._0_8_ = 0x4000000040000000;
            auVar27._12_4_ = 0x40000000;
            auVar27._16_4_ = 0x40000000;
            auVar27._20_4_ = 0x40000000;
            auVar27._24_4_ = 0x40000000;
            auVar27._28_4_ = 0x40000000;
            local_240 = vfmadd132ps_avx512vl(local_240,auVar150,auVar27);
            auVar104 = local_240;
            local_360 = local_240;
            local_320 = 0;
            local_31c = iVar12;
            local_310 = local_620;
            local_300 = local_4d0._0_8_;
            uStack_2f8 = local_4d0._8_8_;
            local_2f0 = local_4e0._0_8_;
            uStack_2e8 = local_4e0._8_8_;
            local_2e0 = local_4f0;
            uStack_2d8 = uStack_4e8;
            local_2d0 = bVar90;
            local_240 = auVar104;
            if ((pGVar13->mask & (ray->super_RayK<1>).mask) != 0) {
              fVar171 = 1.0 / auVar203._0_4_;
              local_2c0[0] = fVar171 * (auVar195._0_4_ + 0.0);
              local_2c0[1] = fVar171 * (auVar195._4_4_ + 1.0);
              local_2c0[2] = fVar171 * (auVar195._8_4_ + 2.0);
              local_2c0[3] = fVar171 * (auVar195._12_4_ + 3.0);
              fStack_2b0 = fVar171 * (auVar195._16_4_ + 4.0);
              fStack_2ac = fVar171 * (auVar195._20_4_ + 5.0);
              fStack_2a8 = fVar171 * (auVar195._24_4_ + 6.0);
              fStack_2a4 = auVar195._28_4_ + 7.0;
              local_2a0 = local_240._0_8_;
              uStack_298 = local_240._8_8_;
              uStack_290 = local_240._16_8_;
              uStack_288 = local_240._24_8_;
              local_280 = local_340;
              auVar151._8_4_ = 0x7f800000;
              auVar151._0_8_ = 0x7f8000007f800000;
              auVar151._12_4_ = 0x7f800000;
              auVar151._16_4_ = 0x7f800000;
              auVar151._20_4_ = 0x7f800000;
              auVar151._24_4_ = 0x7f800000;
              auVar151._28_4_ = 0x7f800000;
              auVar102 = vblendmps_avx512vl(auVar151,local_340);
              auVar126._0_4_ =
                   (uint)(bVar90 & 1) * auVar102._0_4_ | (uint)!(bool)(bVar90 & 1) * 0x7f800000;
              bVar15 = (bool)(bVar90 >> 1 & 1);
              auVar126._4_4_ = (uint)bVar15 * auVar102._4_4_ | (uint)!bVar15 * 0x7f800000;
              bVar15 = (bool)(bVar90 >> 2 & 1);
              auVar126._8_4_ = (uint)bVar15 * auVar102._8_4_ | (uint)!bVar15 * 0x7f800000;
              bVar15 = (bool)(bVar90 >> 3 & 1);
              auVar126._12_4_ = (uint)bVar15 * auVar102._12_4_ | (uint)!bVar15 * 0x7f800000;
              bVar15 = (bool)(bVar90 >> 4 & 1);
              auVar126._16_4_ = (uint)bVar15 * auVar102._16_4_ | (uint)!bVar15 * 0x7f800000;
              bVar15 = (bool)(bVar90 >> 5 & 1);
              auVar126._20_4_ = (uint)bVar15 * auVar102._20_4_ | (uint)!bVar15 * 0x7f800000;
              bVar15 = (bool)(bVar90 >> 6 & 1);
              auVar126._24_4_ = (uint)bVar15 * auVar102._24_4_ | (uint)!bVar15 * 0x7f800000;
              auVar126._28_4_ =
                   (uint)(bVar90 >> 7) * auVar102._28_4_ | (uint)!(bool)(bVar90 >> 7) * 0x7f800000;
              auVar102 = vshufps_avx(auVar126,auVar126,0xb1);
              auVar102 = vminps_avx(auVar126,auVar102);
              auVar115 = vshufpd_avx(auVar102,auVar102,5);
              auVar102 = vminps_avx(auVar102,auVar115);
              auVar115 = vpermpd_avx2(auVar102,0x4e);
              auVar102 = vminps_avx(auVar102,auVar115);
              uVar149 = vcmpps_avx512vl(auVar126,auVar102,0);
              bVar77 = (byte)uVar149 & bVar90;
              bVar78 = bVar90;
              if (bVar77 != 0) {
                bVar78 = bVar77;
              }
              uVar83 = 0;
              for (uVar80 = (uint)bVar78; (uVar80 & 1) == 0; uVar80 = uVar80 >> 1 | 0x80000000) {
                uVar83 = uVar83 + 1;
              }
              uVar79 = (ulong)uVar83;
              if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                 (pGVar13->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                fVar171 = local_2c0[uVar79];
                fVar147 = *(float *)((long)&local_2a0 + uVar79 * 4);
                fVar185 = 1.0 - fVar171;
                fVar184 = fVar185 * fVar185 * -3.0;
                auVar93 = vfmadd231ss_fma(ZEXT416((uint)(fVar185 * fVar185)),
                                          ZEXT416((uint)(fVar171 * fVar185)),ZEXT416(0xc0000000));
                auVar212 = vfmsub132ss_fma(ZEXT416((uint)(fVar171 * fVar185)),
                                           ZEXT416((uint)(fVar171 * fVar171)),ZEXT416(0x40000000));
                fVar185 = auVar93._0_4_ * 3.0;
                fVar186 = auVar212._0_4_ * 3.0;
                fVar179 = fVar171 * fVar171 * 3.0;
                auVar187._0_4_ = fVar179 * (float)local_4f0._0_4_;
                auVar187._4_4_ = fVar179 * (float)local_4f0._4_4_;
                auVar187._8_4_ = fVar179 * (float)uStack_4e8;
                auVar187._12_4_ = fVar179 * uStack_4e8._4_4_;
                auVar161._4_4_ = fVar186;
                auVar161._0_4_ = fVar186;
                auVar161._8_4_ = fVar186;
                auVar161._12_4_ = fVar186;
                auVar93 = vfmadd132ps_fma(auVar161,auVar187,local_4e0);
                auVar195 = ZEXT3264(local_380);
                auVar172._4_4_ = fVar185;
                auVar172._0_4_ = fVar185;
                auVar172._8_4_ = fVar185;
                auVar172._12_4_ = fVar185;
                auVar93 = vfmadd132ps_fma(auVar172,auVar93,local_4d0);
                auVar162._4_4_ = fVar184;
                auVar162._0_4_ = fVar184;
                auVar162._8_4_ = fVar184;
                auVar162._12_4_ = fVar184;
                (ray->super_RayK<1>).tfar = *(float *)(local_280 + uVar79 * 4);
                auVar93 = vfmadd213ps_fma(auVar162,local_620,auVar93);
                auVar178 = ZEXT3264(local_340);
                uVar149 = vmovlps_avx(auVar93);
                *(undefined8 *)&(ray->Ng).field_0 = uVar149;
                fVar184 = (float)vextractps_avx(auVar93,2);
                (ray->Ng).field_0.field_0.z = fVar184;
                ray->u = fVar171;
                ray->v = fVar147;
                ray->primID = uVar88;
                ray->geomID = uVar82;
                ray->instID[0] = context->user->instID[0];
                ray->instPrimID[0] = context->user->instPrimID[0];
              }
              else {
                local_580 = local_4d0._0_4_;
                uStack_57c = local_4d0._4_4_;
                uStack_578 = local_4d0._8_8_;
                local_430 = (RTCRayQueryContext *)local_4e0._0_8_;
                uStack_428 = local_4e0._8_8_;
                local_440 = local_4f0;
                uStack_438 = uStack_4e8;
                local_630 = pPVar87;
                local_638 = context;
                local_640 = ray;
                local_648 = pre;
                local_5a0 = local_380;
                local_600 = local_340;
                _local_4f0 = auVar10;
                local_4e0 = auVar159;
                local_4d0 = auVar160;
                local_3e0 = auVar107;
                local_3c0 = auVar108;
                do {
                  auVar212 = auVar213._0_16_;
                  local_564 = local_2c0[uVar79];
                  local_560 = *(undefined4 *)((long)&local_2a0 + uVar79 * 4);
                  local_3e0._0_4_ = (ray->super_RayK<1>).tfar;
                  local_3c0._0_8_ = uVar79;
                  (ray->super_RayK<1>).tfar = *(float *)(local_280 + uVar79 * 4);
                  local_5d0.context = context->user;
                  fVar147 = 1.0 - local_564;
                  fVar171 = fVar147 * fVar147 * -3.0;
                  auVar95 = vfmadd231ss_fma(ZEXT416((uint)(fVar147 * fVar147)),
                                            ZEXT416((uint)(local_564 * fVar147)),ZEXT416(0xc0000000)
                                           );
                  auVar93 = vfmsub132ss_fma(ZEXT416((uint)(local_564 * fVar147)),
                                            ZEXT416((uint)(local_564 * local_564)),
                                            ZEXT416(0x40000000));
                  fVar147 = auVar95._0_4_ * 3.0;
                  fVar184 = auVar93._0_4_ * 3.0;
                  fVar185 = local_564 * local_564 * 3.0;
                  auVar190._0_4_ = fVar185 * (float)local_440;
                  auVar190._4_4_ = fVar185 * local_440._4_4_;
                  auVar190._8_4_ = fVar185 * (float)uStack_438;
                  auVar190._12_4_ = fVar185 * uStack_438._4_4_;
                  auVar167._4_4_ = fVar184;
                  auVar167._0_4_ = fVar184;
                  auVar167._8_4_ = fVar184;
                  auVar167._12_4_ = fVar184;
                  auVar73._8_8_ = uStack_428;
                  auVar73._0_8_ = local_430;
                  auVar95 = vfmadd132ps_fma(auVar167,auVar190,auVar73);
                  auVar175._4_4_ = fVar147;
                  auVar175._0_4_ = fVar147;
                  auVar175._8_4_ = fVar147;
                  auVar175._12_4_ = fVar147;
                  auVar72._4_4_ = uStack_57c;
                  auVar72._0_4_ = local_580;
                  auVar72._8_8_ = uStack_578;
                  auVar95 = vfmadd132ps_fma(auVar175,auVar95,auVar72);
                  auVar168._4_4_ = fVar171;
                  auVar168._0_4_ = fVar171;
                  auVar168._8_4_ = fVar171;
                  auVar168._12_4_ = fVar171;
                  auVar95 = vfmadd213ps_fma(auVar168,auVar198._0_16_,auVar95);
                  local_570 = vmovlps_avx(auVar95);
                  local_568 = vextractps_avx(auVar95,2);
                  local_55c = uVar88;
                  local_558 = (int)local_628;
                  local_554 = (local_5d0.context)->instID[0];
                  local_550 = (local_5d0.context)->instPrimID[0];
                  local_64c = -1;
                  local_5d0.valid = &local_64c;
                  local_5d0.geometryUserPtr = pGVar13->userPtr;
                  local_5d0.ray = (RTCRayN *)ray;
                  local_5d0.hit = (RTCHitN *)&local_570;
                  local_5d0.N = 1;
                  if (pGVar13->intersectionFilterN == (RTCFilterFunctionN)0x0) {
LAB_01d18c54:
                    auVar95 = auVar213._0_16_;
                    p_Var14 = context->args->filter;
                    if (p_Var14 != (RTCFilterFunctionN)0x0) {
                      if (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                           RTC_RAY_QUERY_FLAG_INCOHERENT) ||
                         (((pGVar13->field_8).field_0x2 & 0x40) != 0)) {
                        (*p_Var14)(&local_5d0);
                        auVar214 = ZEXT1664(CONCAT412(uStack_3f4,
                                                      CONCAT48(uStack_3f8,
                                                               CONCAT44(uStack_3fc,local_400))));
                        auVar216 = ZEXT3264(local_4c0);
                        auVar215 = ZEXT3264(local_4a0);
                        auVar210 = ZEXT3264(local_540);
                        auVar209 = ZEXT3264(local_520);
                        auVar211 = ZEXT3264(local_420);
                        auVar198 = ZEXT1664(local_620);
                        in_ZMM21 = ZEXT3264(local_480);
                        in_ZMM20 = ZEXT3264(local_460);
                        auVar95 = vxorps_avx512vl(auVar95,auVar95);
                        auVar213 = ZEXT1664(auVar95);
                        ray = local_640;
                        pre = local_648;
                        pPVar87 = local_630;
                        context = local_638;
                        uVar81 = local_610._0_4_;
                      }
                      if (*local_5d0.valid == 0) goto LAB_01d18d65;
                    }
                    (((Vec3f *)((long)local_5d0.ray + 0x30))->field_0).components[0] =
                         *(float *)local_5d0.hit;
                    (((Vec3f *)((long)local_5d0.ray + 0x30))->field_0).field_0.y =
                         *(float *)(local_5d0.hit + 4);
                    (((Vec3f *)((long)local_5d0.ray + 0x30))->field_0).field_0.z =
                         *(float *)(local_5d0.hit + 8);
                    *(float *)((long)local_5d0.ray + 0x3c) = *(float *)(local_5d0.hit + 0xc);
                    *(float *)((long)local_5d0.ray + 0x40) = *(float *)(local_5d0.hit + 0x10);
                    *(float *)((long)local_5d0.ray + 0x44) = *(float *)(local_5d0.hit + 0x14);
                    *(float *)((long)local_5d0.ray + 0x48) = *(float *)(local_5d0.hit + 0x18);
                    *(float *)((long)local_5d0.ray + 0x4c) = *(float *)(local_5d0.hit + 0x1c);
                    *(float *)((long)local_5d0.ray + 0x50) = *(float *)(local_5d0.hit + 0x20);
                  }
                  else {
                    (*pGVar13->intersectionFilterN)(&local_5d0);
                    auVar214 = ZEXT1664(CONCAT412(uStack_3f4,
                                                  CONCAT48(uStack_3f8,CONCAT44(uStack_3fc,local_400)
                                                          )));
                    auVar216 = ZEXT3264(local_4c0);
                    auVar215 = ZEXT3264(local_4a0);
                    auVar210 = ZEXT3264(local_540);
                    auVar209 = ZEXT3264(local_520);
                    auVar211 = ZEXT3264(local_420);
                    auVar198 = ZEXT1664(local_620);
                    in_ZMM21 = ZEXT3264(local_480);
                    in_ZMM20 = ZEXT3264(local_460);
                    auVar95 = vxorps_avx512vl(auVar212,auVar212);
                    auVar213 = ZEXT1664(auVar95);
                    ray = local_640;
                    pre = local_648;
                    pPVar87 = local_630;
                    context = local_638;
                    uVar81 = local_610._0_4_;
                    if (*local_5d0.valid != 0) goto LAB_01d18c54;
LAB_01d18d65:
                    (ray->super_RayK<1>).tfar = (float)local_3e0._0_4_;
                  }
                  auVar95 = auVar214._0_16_;
                  auVar178 = ZEXT3264(local_600);
                  bVar78 = ~(byte)(1 << (local_3c0._0_4_ & 0x1f)) & bVar90;
                  fVar171 = (ray->super_RayK<1>).tfar;
                  auVar34._4_4_ = fVar171;
                  auVar34._0_4_ = fVar171;
                  auVar34._8_4_ = fVar171;
                  auVar34._12_4_ = fVar171;
                  auVar34._16_4_ = fVar171;
                  auVar34._20_4_ = fVar171;
                  auVar34._24_4_ = fVar171;
                  auVar34._28_4_ = fVar171;
                  uVar149 = vcmpps_avx512vl(local_600,auVar34,2);
                  bVar90 = bVar78 & (byte)uVar149;
                  auVar195 = ZEXT3264(local_5a0);
                  uVar79 = local_3c0._0_8_;
                  if ((bVar78 & (byte)uVar149) != 0) {
                    auVar156._8_4_ = 0x7f800000;
                    auVar156._0_8_ = 0x7f8000007f800000;
                    auVar156._12_4_ = 0x7f800000;
                    auVar156._16_4_ = 0x7f800000;
                    auVar156._20_4_ = 0x7f800000;
                    auVar156._24_4_ = 0x7f800000;
                    auVar156._28_4_ = 0x7f800000;
                    auVar104 = vblendmps_avx512vl(auVar156,local_600);
                    auVar138._0_4_ =
                         (uint)(bVar90 & 1) * auVar104._0_4_ |
                         (uint)!(bool)(bVar90 & 1) * 0x7f800000;
                    bVar15 = (bool)(bVar90 >> 1 & 1);
                    auVar138._4_4_ = (uint)bVar15 * auVar104._4_4_ | (uint)!bVar15 * 0x7f800000;
                    bVar15 = (bool)(bVar90 >> 2 & 1);
                    auVar138._8_4_ = (uint)bVar15 * auVar104._8_4_ | (uint)!bVar15 * 0x7f800000;
                    bVar15 = (bool)(bVar90 >> 3 & 1);
                    auVar138._12_4_ = (uint)bVar15 * auVar104._12_4_ | (uint)!bVar15 * 0x7f800000;
                    bVar15 = (bool)(bVar90 >> 4 & 1);
                    auVar138._16_4_ = (uint)bVar15 * auVar104._16_4_ | (uint)!bVar15 * 0x7f800000;
                    bVar15 = (bool)(bVar90 >> 5 & 1);
                    auVar138._20_4_ = (uint)bVar15 * auVar104._20_4_ | (uint)!bVar15 * 0x7f800000;
                    bVar15 = (bool)(bVar90 >> 6 & 1);
                    auVar138._24_4_ = (uint)bVar15 * auVar104._24_4_ | (uint)!bVar15 * 0x7f800000;
                    auVar138._28_4_ =
                         (uint)(bVar90 >> 7) * auVar104._28_4_ |
                         (uint)!(bool)(bVar90 >> 7) * 0x7f800000;
                    auVar104 = vshufps_avx(auVar138,auVar138,0xb1);
                    auVar104 = vminps_avx(auVar138,auVar104);
                    auVar102 = vshufpd_avx(auVar104,auVar104,5);
                    auVar104 = vminps_avx(auVar104,auVar102);
                    auVar102 = vpermpd_avx2(auVar104,0x4e);
                    auVar104 = vminps_avx(auVar104,auVar102);
                    uVar149 = vcmpps_avx512vl(auVar138,auVar104,0);
                    bVar77 = (byte)uVar149 & bVar90;
                    bVar78 = bVar90;
                    if (bVar77 != 0) {
                      bVar78 = bVar77;
                    }
                    uVar82 = 0;
                    for (uVar83 = (uint)bVar78; (uVar83 & 1) == 0; uVar83 = uVar83 >> 1 | 0x80000000
                        ) {
                      uVar82 = uVar82 + 1;
                    }
                    uVar79 = (ulong)uVar82;
                  }
                  auVar10 = _local_4f0;
                  auVar159 = local_4e0;
                  auVar160 = local_4d0;
                } while (bVar90 != 0);
              }
            }
          }
        }
      }
      local_4d0 = auVar160;
      local_4e0 = auVar159;
      _local_4f0 = auVar10;
      if (8 < iVar12) {
        local_3c0 = vpbroadcastd_avx512vl();
        local_3e0 = vbroadcastss_avx512vl(auVar95);
        local_400 = uVar81;
        uStack_3fc = uVar81;
        uStack_3f8 = uVar81;
        uStack_3f4 = uVar81;
        uStack_3f0 = uVar81;
        uStack_3ec = uVar81;
        uStack_3e8 = uVar81;
        uStack_3e4 = uVar81;
        local_3a0._4_4_ = 1.0 / (float)local_3a0._0_4_;
        local_3a0._0_4_ = local_3a0._4_4_;
        fStack_398 = (float)local_3a0._4_4_;
        fStack_394 = (float)local_3a0._4_4_;
        fStack_390 = (float)local_3a0._4_4_;
        fStack_38c = (float)local_3a0._4_4_;
        fStack_388 = (float)local_3a0._4_4_;
        fStack_384 = (float)local_3a0._4_4_;
        lVar85 = 8;
        local_5a0 = auVar195._0_32_;
        local_600 = auVar178._0_32_;
        do {
          auVar104 = vpbroadcastd_avx512vl();
          auVar105 = vpor_avx2(auVar104,_DAT_0205a920);
          uVar22 = vpcmpd_avx512vl(auVar105,local_3c0,1);
          auVar104 = *(undefined1 (*) [32])(bezier_basis0 + lVar85 * 4 + lVar23);
          auVar102 = *(undefined1 (*) [32])(lVar23 + 0x2227768 + lVar85 * 4);
          auVar115 = *(undefined1 (*) [32])(lVar23 + 0x2227bec + lVar85 * 4);
          auVar114 = *(undefined1 (*) [32])(lVar23 + 0x2228070 + lVar85 * 4);
          local_4a0 = auVar215._0_32_;
          auVar103 = vmulps_avx512vl(local_4a0,auVar114);
          local_4c0 = auVar216._0_32_;
          auVar113 = vmulps_avx512vl(local_4c0,auVar114);
          auVar52._4_4_ = auVar114._4_4_ * (float)local_140._4_4_;
          auVar52._0_4_ = auVar114._0_4_ * (float)local_140._0_4_;
          auVar52._8_4_ = auVar114._8_4_ * fStack_138;
          auVar52._12_4_ = auVar114._12_4_ * fStack_134;
          auVar52._16_4_ = auVar114._16_4_ * fStack_130;
          auVar52._20_4_ = auVar114._20_4_ * fStack_12c;
          auVar52._24_4_ = auVar114._24_4_ * fStack_128;
          auVar52._28_4_ = auVar105._28_4_;
          auVar105 = vfmadd231ps_avx512vl(auVar103,auVar115,local_a0);
          auVar103 = vfmadd231ps_avx512vl(auVar113,auVar115,local_c0);
          auVar113 = vfmadd231ps_avx512vl(auVar52,auVar115,local_120);
          auVar169 = auVar210._0_32_;
          auVar105 = vfmadd231ps_avx512vl(auVar105,auVar102,auVar169);
          auVar103 = vfmadd231ps_avx512vl(auVar103,auVar102,local_220);
          auVar95 = vfmadd231ps_fma(auVar113,auVar102,local_100);
          auVar193 = auVar211._0_32_;
          auVar101 = vfmadd231ps_avx512vl(auVar105,auVar104,auVar193);
          auVar157 = auVar209._0_32_;
          auVar106 = vfmadd231ps_avx512vl(auVar103,auVar104,auVar157);
          auVar105 = *(undefined1 (*) [32])(bezier_basis1 + lVar85 * 4 + lVar23);
          auVar103 = *(undefined1 (*) [32])(lVar23 + 0x2229b88 + lVar85 * 4);
          auVar95 = vfmadd231ps_fma(ZEXT1632(auVar95),auVar104,local_e0);
          auVar113 = *(undefined1 (*) [32])(lVar23 + 0x222a00c + lVar85 * 4);
          auVar112 = *(undefined1 (*) [32])(lVar23 + 0x222a490 + lVar85 * 4);
          auVar107 = vmulps_avx512vl(local_4a0,auVar112);
          auVar108 = vmulps_avx512vl(local_4c0,auVar112);
          auVar53._4_4_ = auVar112._4_4_ * (float)local_140._4_4_;
          auVar53._0_4_ = auVar112._0_4_ * (float)local_140._0_4_;
          auVar53._8_4_ = auVar112._8_4_ * fStack_138;
          auVar53._12_4_ = auVar112._12_4_ * fStack_134;
          auVar53._16_4_ = auVar112._16_4_ * fStack_130;
          auVar53._20_4_ = auVar112._20_4_ * fStack_12c;
          auVar53._24_4_ = auVar112._24_4_ * fStack_128;
          auVar53._28_4_ = uStack_124;
          auVar107 = vfmadd231ps_avx512vl(auVar107,auVar113,local_a0);
          auVar108 = vfmadd231ps_avx512vl(auVar108,auVar113,local_c0);
          auVar109 = vfmadd231ps_avx512vl(auVar53,auVar113,local_120);
          auVar107 = vfmadd231ps_avx512vl(auVar107,auVar103,auVar169);
          auVar108 = vfmadd231ps_avx512vl(auVar108,auVar103,local_220);
          auVar93 = vfmadd231ps_fma(auVar109,auVar103,local_100);
          auVar109 = vfmadd231ps_avx512vl(auVar107,auVar105,auVar193);
          auVar99 = vfmadd231ps_avx512vl(auVar108,auVar105,auVar157);
          auVar93 = vfmadd231ps_fma(ZEXT1632(auVar93),auVar105,local_e0);
          auVar100 = vmaxps_avx512vl(ZEXT1632(auVar95),ZEXT1632(auVar93));
          auVar107 = vsubps_avx(auVar109,auVar101);
          auVar108 = vsubps_avx(auVar99,auVar106);
          auVar110 = vmulps_avx512vl(auVar106,auVar107);
          auVar111 = vmulps_avx512vl(auVar101,auVar108);
          auVar110 = vsubps_avx512vl(auVar110,auVar111);
          auVar111 = vmulps_avx512vl(auVar108,auVar108);
          auVar111 = vfmadd231ps_avx512vl(auVar111,auVar107,auVar107);
          auVar100 = vmulps_avx512vl(auVar100,auVar100);
          auVar100 = vmulps_avx512vl(auVar100,auVar111);
          auVar110 = vmulps_avx512vl(auVar110,auVar110);
          uVar149 = vcmpps_avx512vl(auVar110,auVar100,2);
          local_2d0 = (byte)uVar22 & (byte)uVar149;
          if (local_2d0 == 0) {
            auVar195 = ZEXT3264(local_5a0);
            auVar178 = ZEXT3264(local_600);
            auVar209 = ZEXT3264(auVar157);
            auVar210 = ZEXT3264(auVar169);
          }
          else {
            auVar112 = vmulps_avx512vl(local_1c0,auVar112);
            auVar113 = vfmadd213ps_avx512vl(auVar113,local_1a0,auVar112);
            auVar103 = vfmadd213ps_avx512vl(auVar103,local_180,auVar113);
            auVar105 = vfmadd213ps_avx512vl(auVar105,local_160,auVar103);
            auVar114 = vmulps_avx512vl(local_1c0,auVar114);
            auVar115 = vfmadd213ps_avx512vl(auVar115,local_1a0,auVar114);
            auVar102 = vfmadd213ps_avx512vl(auVar102,local_180,auVar115);
            auVar103 = vfmadd213ps_avx512vl(auVar104,local_160,auVar102);
            auVar104 = *(undefined1 (*) [32])(lVar23 + 0x22284f4 + lVar85 * 4);
            auVar102 = *(undefined1 (*) [32])(lVar23 + 0x2228978 + lVar85 * 4);
            auVar115 = *(undefined1 (*) [32])(lVar23 + 0x2228dfc + lVar85 * 4);
            auVar114 = *(undefined1 (*) [32])(lVar23 + 0x2229280 + lVar85 * 4);
            auVar113 = vmulps_avx512vl(local_4a0,auVar114);
            auVar112 = vmulps_avx512vl(local_4c0,auVar114);
            auVar114 = vmulps_avx512vl(local_1c0,auVar114);
            auVar113 = vfmadd231ps_avx512vl(auVar113,auVar115,local_a0);
            auVar112 = vfmadd231ps_avx512vl(auVar112,auVar115,local_c0);
            auVar115 = vfmadd231ps_avx512vl(auVar114,local_1a0,auVar115);
            auVar114 = vfmadd231ps_avx512vl(auVar113,auVar102,auVar169);
            auVar113 = vfmadd231ps_avx512vl(auVar112,auVar102,local_220);
            auVar102 = vfmadd231ps_avx512vl(auVar115,local_180,auVar102);
            auVar114 = vfmadd231ps_avx512vl(auVar114,auVar104,auVar193);
            auVar113 = vfmadd231ps_avx512vl(auVar113,auVar104,auVar157);
            auVar112 = vfmadd231ps_avx512vl(auVar102,local_160,auVar104);
            auVar104 = *(undefined1 (*) [32])(lVar23 + 0x222a914 + lVar85 * 4);
            auVar102 = *(undefined1 (*) [32])(lVar23 + 0x222b21c + lVar85 * 4);
            auVar115 = *(undefined1 (*) [32])(lVar23 + 0x222b6a0 + lVar85 * 4);
            auVar100 = vmulps_avx512vl(local_4a0,auVar115);
            auVar110 = vmulps_avx512vl(local_4c0,auVar115);
            auVar115 = vmulps_avx512vl(local_1c0,auVar115);
            auVar100 = vfmadd231ps_avx512vl(auVar100,auVar102,local_a0);
            auVar110 = vfmadd231ps_avx512vl(auVar110,auVar102,local_c0);
            auVar115 = vfmadd231ps_avx512vl(auVar115,local_1a0,auVar102);
            auVar102 = *(undefined1 (*) [32])(lVar23 + 0x222ad98 + lVar85 * 4);
            auVar100 = vfmadd231ps_avx512vl(auVar100,auVar102,auVar169);
            auVar212 = vfmadd231ps_fma(auVar110,auVar102,local_220);
            auVar102 = vfmadd231ps_avx512vl(auVar115,local_180,auVar102);
            auVar115 = vfmadd231ps_avx512vl(auVar100,auVar104,auVar193);
            auVar100 = vfmadd231ps_avx512vl(ZEXT1632(auVar212),auVar104,auVar157);
            auVar102 = vfmadd231ps_avx512vl(auVar102,local_160,auVar104);
            auVar110 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
            vandps_avx512vl(auVar114,auVar110);
            vandps_avx512vl(auVar113,auVar110);
            auVar104 = vmaxps_avx(auVar110,auVar110);
            vandps_avx512vl(auVar112,auVar110);
            auVar104 = vmaxps_avx(auVar104,auVar110);
            uVar79 = vcmpps_avx512vl(auVar104,local_3e0,1);
            bVar15 = (bool)((byte)uVar79 & 1);
            auVar127._0_4_ = (float)((uint)bVar15 * auVar107._0_4_ | (uint)!bVar15 * auVar114._0_4_)
            ;
            bVar15 = (bool)((byte)(uVar79 >> 1) & 1);
            auVar127._4_4_ = (float)((uint)bVar15 * auVar107._4_4_ | (uint)!bVar15 * auVar114._4_4_)
            ;
            bVar15 = (bool)((byte)(uVar79 >> 2) & 1);
            auVar127._8_4_ = (float)((uint)bVar15 * auVar107._8_4_ | (uint)!bVar15 * auVar114._8_4_)
            ;
            bVar15 = (bool)((byte)(uVar79 >> 3) & 1);
            auVar127._12_4_ =
                 (float)((uint)bVar15 * auVar107._12_4_ | (uint)!bVar15 * auVar114._12_4_);
            bVar15 = (bool)((byte)(uVar79 >> 4) & 1);
            auVar127._16_4_ =
                 (float)((uint)bVar15 * auVar107._16_4_ | (uint)!bVar15 * auVar114._16_4_);
            bVar15 = (bool)((byte)(uVar79 >> 5) & 1);
            auVar127._20_4_ =
                 (float)((uint)bVar15 * auVar107._20_4_ | (uint)!bVar15 * auVar114._20_4_);
            bVar15 = (bool)((byte)(uVar79 >> 6) & 1);
            auVar127._24_4_ =
                 (float)((uint)bVar15 * auVar107._24_4_ | (uint)!bVar15 * auVar114._24_4_);
            bVar15 = SUB81(uVar79 >> 7,0);
            auVar127._28_4_ = (uint)bVar15 * auVar107._28_4_ | (uint)!bVar15 * auVar114._28_4_;
            bVar15 = (bool)((byte)uVar79 & 1);
            auVar128._0_4_ = (float)((uint)bVar15 * auVar108._0_4_ | (uint)!bVar15 * auVar113._0_4_)
            ;
            bVar15 = (bool)((byte)(uVar79 >> 1) & 1);
            auVar128._4_4_ = (float)((uint)bVar15 * auVar108._4_4_ | (uint)!bVar15 * auVar113._4_4_)
            ;
            bVar15 = (bool)((byte)(uVar79 >> 2) & 1);
            auVar128._8_4_ = (float)((uint)bVar15 * auVar108._8_4_ | (uint)!bVar15 * auVar113._8_4_)
            ;
            bVar15 = (bool)((byte)(uVar79 >> 3) & 1);
            auVar128._12_4_ =
                 (float)((uint)bVar15 * auVar108._12_4_ | (uint)!bVar15 * auVar113._12_4_);
            bVar15 = (bool)((byte)(uVar79 >> 4) & 1);
            auVar128._16_4_ =
                 (float)((uint)bVar15 * auVar108._16_4_ | (uint)!bVar15 * auVar113._16_4_);
            bVar15 = (bool)((byte)(uVar79 >> 5) & 1);
            auVar128._20_4_ =
                 (float)((uint)bVar15 * auVar108._20_4_ | (uint)!bVar15 * auVar113._20_4_);
            bVar15 = (bool)((byte)(uVar79 >> 6) & 1);
            auVar128._24_4_ =
                 (float)((uint)bVar15 * auVar108._24_4_ | (uint)!bVar15 * auVar113._24_4_);
            bVar15 = SUB81(uVar79 >> 7,0);
            auVar128._28_4_ = (uint)bVar15 * auVar108._28_4_ | (uint)!bVar15 * auVar113._28_4_;
            vandps_avx512vl(auVar115,auVar110);
            vandps_avx512vl(auVar100,auVar110);
            auVar104 = vmaxps_avx(auVar128,auVar128);
            vandps_avx512vl(auVar102,auVar110);
            auVar104 = vmaxps_avx(auVar104,auVar128);
            uVar79 = vcmpps_avx512vl(auVar104,local_3e0,1);
            bVar15 = (bool)((byte)uVar79 & 1);
            auVar129._0_4_ = (uint)bVar15 * auVar107._0_4_ | (uint)!bVar15 * auVar115._0_4_;
            bVar15 = (bool)((byte)(uVar79 >> 1) & 1);
            auVar129._4_4_ = (uint)bVar15 * auVar107._4_4_ | (uint)!bVar15 * auVar115._4_4_;
            bVar15 = (bool)((byte)(uVar79 >> 2) & 1);
            auVar129._8_4_ = (uint)bVar15 * auVar107._8_4_ | (uint)!bVar15 * auVar115._8_4_;
            bVar15 = (bool)((byte)(uVar79 >> 3) & 1);
            auVar129._12_4_ = (uint)bVar15 * auVar107._12_4_ | (uint)!bVar15 * auVar115._12_4_;
            bVar15 = (bool)((byte)(uVar79 >> 4) & 1);
            auVar129._16_4_ = (uint)bVar15 * auVar107._16_4_ | (uint)!bVar15 * auVar115._16_4_;
            bVar15 = (bool)((byte)(uVar79 >> 5) & 1);
            auVar129._20_4_ = (uint)bVar15 * auVar107._20_4_ | (uint)!bVar15 * auVar115._20_4_;
            bVar15 = (bool)((byte)(uVar79 >> 6) & 1);
            auVar129._24_4_ = (uint)bVar15 * auVar107._24_4_ | (uint)!bVar15 * auVar115._24_4_;
            bVar15 = SUB81(uVar79 >> 7,0);
            auVar129._28_4_ = (uint)bVar15 * auVar107._28_4_ | (uint)!bVar15 * auVar115._28_4_;
            bVar15 = (bool)((byte)uVar79 & 1);
            auVar130._0_4_ = (float)((uint)bVar15 * auVar108._0_4_ | (uint)!bVar15 * auVar100._0_4_)
            ;
            bVar15 = (bool)((byte)(uVar79 >> 1) & 1);
            auVar130._4_4_ = (float)((uint)bVar15 * auVar108._4_4_ | (uint)!bVar15 * auVar100._4_4_)
            ;
            bVar15 = (bool)((byte)(uVar79 >> 2) & 1);
            auVar130._8_4_ = (float)((uint)bVar15 * auVar108._8_4_ | (uint)!bVar15 * auVar100._8_4_)
            ;
            bVar15 = (bool)((byte)(uVar79 >> 3) & 1);
            auVar130._12_4_ =
                 (float)((uint)bVar15 * auVar108._12_4_ | (uint)!bVar15 * auVar100._12_4_);
            bVar15 = (bool)((byte)(uVar79 >> 4) & 1);
            auVar130._16_4_ =
                 (float)((uint)bVar15 * auVar108._16_4_ | (uint)!bVar15 * auVar100._16_4_);
            bVar15 = (bool)((byte)(uVar79 >> 5) & 1);
            auVar130._20_4_ =
                 (float)((uint)bVar15 * auVar108._20_4_ | (uint)!bVar15 * auVar100._20_4_);
            bVar15 = (bool)((byte)(uVar79 >> 6) & 1);
            auVar130._24_4_ =
                 (float)((uint)bVar15 * auVar108._24_4_ | (uint)!bVar15 * auVar100._24_4_);
            bVar15 = SUB81(uVar79 >> 7,0);
            auVar130._28_4_ = (uint)bVar15 * auVar108._28_4_ | (uint)!bVar15 * auVar100._28_4_;
            auVar201._8_4_ = 0x80000000;
            auVar201._0_8_ = 0x8000000080000000;
            auVar201._12_4_ = 0x80000000;
            auVar201._16_4_ = 0x80000000;
            auVar201._20_4_ = 0x80000000;
            auVar201._24_4_ = 0x80000000;
            auVar201._28_4_ = 0x80000000;
            auVar104 = vxorps_avx512vl(auVar129,auVar201);
            auVar100 = auVar213._0_32_;
            auVar102 = vfmadd213ps_avx512vl(auVar127,auVar127,auVar100);
            auVar212 = vfmadd231ps_fma(auVar102,auVar128,auVar128);
            auVar102 = vrsqrt14ps_avx512vl(ZEXT1632(auVar212));
            auVar208._8_4_ = 0xbf000000;
            auVar208._0_8_ = 0xbf000000bf000000;
            auVar208._12_4_ = 0xbf000000;
            auVar208._16_4_ = 0xbf000000;
            auVar208._20_4_ = 0xbf000000;
            auVar208._24_4_ = 0xbf000000;
            auVar208._28_4_ = 0xbf000000;
            fVar171 = auVar102._0_4_;
            fVar147 = auVar102._4_4_;
            fVar184 = auVar102._8_4_;
            fVar185 = auVar102._12_4_;
            fVar186 = auVar102._16_4_;
            fVar179 = auVar102._20_4_;
            fVar91 = auVar102._24_4_;
            auVar54._4_4_ = fVar147 * fVar147 * fVar147 * auVar212._4_4_ * -0.5;
            auVar54._0_4_ = fVar171 * fVar171 * fVar171 * auVar212._0_4_ * -0.5;
            auVar54._8_4_ = fVar184 * fVar184 * fVar184 * auVar212._8_4_ * -0.5;
            auVar54._12_4_ = fVar185 * fVar185 * fVar185 * auVar212._12_4_ * -0.5;
            auVar54._16_4_ = fVar186 * fVar186 * fVar186 * -0.0;
            auVar54._20_4_ = fVar179 * fVar179 * fVar179 * -0.0;
            auVar54._24_4_ = fVar91 * fVar91 * fVar91 * -0.0;
            auVar54._28_4_ = auVar128._28_4_;
            auVar115 = vbroadcastss_avx512vl(ZEXT416(0x3fc00000));
            auVar102 = vfmadd231ps_avx512vl(auVar54,auVar115,auVar102);
            auVar55._4_4_ = auVar128._4_4_ * auVar102._4_4_;
            auVar55._0_4_ = auVar128._0_4_ * auVar102._0_4_;
            auVar55._8_4_ = auVar128._8_4_ * auVar102._8_4_;
            auVar55._12_4_ = auVar128._12_4_ * auVar102._12_4_;
            auVar55._16_4_ = auVar128._16_4_ * auVar102._16_4_;
            auVar55._20_4_ = auVar128._20_4_ * auVar102._20_4_;
            auVar55._24_4_ = auVar128._24_4_ * auVar102._24_4_;
            auVar55._28_4_ = 0;
            auVar56._4_4_ = auVar102._4_4_ * -auVar127._4_4_;
            auVar56._0_4_ = auVar102._0_4_ * -auVar127._0_4_;
            auVar56._8_4_ = auVar102._8_4_ * -auVar127._8_4_;
            auVar56._12_4_ = auVar102._12_4_ * -auVar127._12_4_;
            auVar56._16_4_ = auVar102._16_4_ * -auVar127._16_4_;
            auVar56._20_4_ = auVar102._20_4_ * -auVar127._20_4_;
            auVar56._24_4_ = auVar102._24_4_ * -auVar127._24_4_;
            auVar56._28_4_ = auVar128._28_4_;
            auVar114 = vmulps_avx512vl(auVar102,auVar100);
            auVar102 = vfmadd213ps_avx512vl(auVar129,auVar129,auVar100);
            auVar102 = vfmadd231ps_avx512vl(auVar102,auVar130,auVar130);
            auVar113 = vrsqrt14ps_avx512vl(auVar102);
            auVar102 = vmulps_avx512vl(auVar102,auVar208);
            fVar171 = auVar113._0_4_;
            fVar147 = auVar113._4_4_;
            fVar184 = auVar113._8_4_;
            fVar185 = auVar113._12_4_;
            fVar186 = auVar113._16_4_;
            fVar179 = auVar113._20_4_;
            fVar91 = auVar113._24_4_;
            auVar57._4_4_ = fVar147 * fVar147 * fVar147 * auVar102._4_4_;
            auVar57._0_4_ = fVar171 * fVar171 * fVar171 * auVar102._0_4_;
            auVar57._8_4_ = fVar184 * fVar184 * fVar184 * auVar102._8_4_;
            auVar57._12_4_ = fVar185 * fVar185 * fVar185 * auVar102._12_4_;
            auVar57._16_4_ = fVar186 * fVar186 * fVar186 * auVar102._16_4_;
            auVar57._20_4_ = fVar179 * fVar179 * fVar179 * auVar102._20_4_;
            auVar57._24_4_ = fVar91 * fVar91 * fVar91 * auVar102._24_4_;
            auVar57._28_4_ = auVar102._28_4_;
            auVar102 = vfmadd231ps_avx512vl(auVar57,auVar115,auVar113);
            auVar58._4_4_ = auVar130._4_4_ * auVar102._4_4_;
            auVar58._0_4_ = auVar130._0_4_ * auVar102._0_4_;
            auVar58._8_4_ = auVar130._8_4_ * auVar102._8_4_;
            auVar58._12_4_ = auVar130._12_4_ * auVar102._12_4_;
            auVar58._16_4_ = auVar130._16_4_ * auVar102._16_4_;
            auVar58._20_4_ = auVar130._20_4_ * auVar102._20_4_;
            auVar58._24_4_ = auVar130._24_4_ * auVar102._24_4_;
            auVar58._28_4_ = auVar113._28_4_;
            auVar59._4_4_ = auVar102._4_4_ * auVar104._4_4_;
            auVar59._0_4_ = auVar102._0_4_ * auVar104._0_4_;
            auVar59._8_4_ = auVar102._8_4_ * auVar104._8_4_;
            auVar59._12_4_ = auVar102._12_4_ * auVar104._12_4_;
            auVar59._16_4_ = auVar102._16_4_ * auVar104._16_4_;
            auVar59._20_4_ = auVar102._20_4_ * auVar104._20_4_;
            auVar59._24_4_ = auVar102._24_4_ * auVar104._24_4_;
            auVar59._28_4_ = auVar104._28_4_;
            auVar104 = vmulps_avx512vl(auVar102,auVar100);
            auVar212 = vfmadd213ps_fma(auVar55,ZEXT1632(auVar95),auVar101);
            auVar102 = ZEXT1632(auVar95);
            auVar6 = vfmadd213ps_fma(auVar56,auVar102,auVar106);
            auVar115 = vfmadd213ps_avx512vl(auVar114,auVar102,auVar103);
            auVar113 = vfmadd213ps_avx512vl(auVar58,ZEXT1632(auVar93),auVar109);
            auVar10 = vfnmadd213ps_fma(auVar55,auVar102,auVar101);
            auVar112 = ZEXT1632(auVar93);
            auVar7 = vfmadd213ps_fma(auVar59,auVar112,auVar99);
            auVar159 = vfnmadd213ps_fma(auVar56,auVar102,auVar106);
            auVar8 = vfmadd213ps_fma(auVar104,auVar112,auVar105);
            auVar106 = ZEXT1632(auVar95);
            auVar97 = vfnmadd231ps_fma(auVar103,auVar106,auVar114);
            auVar160 = vfnmadd213ps_fma(auVar58,auVar112,auVar109);
            auVar96 = vfnmadd213ps_fma(auVar59,auVar112,auVar99);
            auVar199 = vfnmadd231ps_fma(auVar105,ZEXT1632(auVar93),auVar104);
            auVar105 = vsubps_avx512vl(auVar113,ZEXT1632(auVar10));
            auVar104 = vsubps_avx(ZEXT1632(auVar7),ZEXT1632(auVar159));
            auVar102 = vsubps_avx(ZEXT1632(auVar8),ZEXT1632(auVar97));
            auVar60._4_4_ = auVar104._4_4_ * auVar97._4_4_;
            auVar60._0_4_ = auVar104._0_4_ * auVar97._0_4_;
            auVar60._8_4_ = auVar104._8_4_ * auVar97._8_4_;
            auVar60._12_4_ = auVar104._12_4_ * auVar97._12_4_;
            auVar60._16_4_ = auVar104._16_4_ * 0.0;
            auVar60._20_4_ = auVar104._20_4_ * 0.0;
            auVar60._24_4_ = auVar104._24_4_ * 0.0;
            auVar60._28_4_ = auVar114._28_4_;
            auVar95 = vfmsub231ps_fma(auVar60,ZEXT1632(auVar159),auVar102);
            auVar61._4_4_ = auVar102._4_4_ * auVar10._4_4_;
            auVar61._0_4_ = auVar102._0_4_ * auVar10._0_4_;
            auVar61._8_4_ = auVar102._8_4_ * auVar10._8_4_;
            auVar61._12_4_ = auVar102._12_4_ * auVar10._12_4_;
            auVar61._16_4_ = auVar102._16_4_ * 0.0;
            auVar61._20_4_ = auVar102._20_4_ * 0.0;
            auVar61._24_4_ = auVar102._24_4_ * 0.0;
            auVar61._28_4_ = auVar102._28_4_;
            auVar9 = vfmsub231ps_fma(auVar61,ZEXT1632(auVar97),auVar105);
            auVar62._4_4_ = auVar159._4_4_ * auVar105._4_4_;
            auVar62._0_4_ = auVar159._0_4_ * auVar105._0_4_;
            auVar62._8_4_ = auVar159._8_4_ * auVar105._8_4_;
            auVar62._12_4_ = auVar159._12_4_ * auVar105._12_4_;
            auVar62._16_4_ = auVar105._16_4_ * 0.0;
            auVar62._20_4_ = auVar105._20_4_ * 0.0;
            auVar62._24_4_ = auVar105._24_4_ * 0.0;
            auVar62._28_4_ = auVar105._28_4_;
            auVar94 = vfmsub231ps_fma(auVar62,ZEXT1632(auVar10),auVar104);
            auVar104 = vfmadd231ps_avx512vl(ZEXT1632(auVar94),auVar100,ZEXT1632(auVar9));
            auVar104 = vfmadd231ps_avx512vl(auVar104,auVar100,ZEXT1632(auVar95));
            uVar79 = vcmpps_avx512vl(auVar104,auVar100,2);
            bVar90 = (byte)uVar79;
            fVar139 = (float)((uint)(bVar90 & 1) * auVar212._0_4_ |
                             (uint)!(bool)(bVar90 & 1) * auVar160._0_4_);
            bVar15 = (bool)((byte)(uVar79 >> 1) & 1);
            fVar141 = (float)((uint)bVar15 * auVar212._4_4_ | (uint)!bVar15 * auVar160._4_4_);
            bVar15 = (bool)((byte)(uVar79 >> 2) & 1);
            fVar144 = (float)((uint)bVar15 * auVar212._8_4_ | (uint)!bVar15 * auVar160._8_4_);
            bVar15 = (bool)((byte)(uVar79 >> 3) & 1);
            fVar145 = (float)((uint)bVar15 * auVar212._12_4_ | (uint)!bVar15 * auVar160._12_4_);
            auVar112 = ZEXT1632(CONCAT412(fVar145,CONCAT48(fVar144,CONCAT44(fVar141,fVar139))));
            fVar140 = (float)((uint)(bVar90 & 1) * auVar6._0_4_ |
                             (uint)!(bool)(bVar90 & 1) * auVar96._0_4_);
            bVar15 = (bool)((byte)(uVar79 >> 1) & 1);
            fVar143 = (float)((uint)bVar15 * auVar6._4_4_ | (uint)!bVar15 * auVar96._4_4_);
            bVar15 = (bool)((byte)(uVar79 >> 2) & 1);
            fVar142 = (float)((uint)bVar15 * auVar6._8_4_ | (uint)!bVar15 * auVar96._8_4_);
            bVar15 = (bool)((byte)(uVar79 >> 3) & 1);
            fVar146 = (float)((uint)bVar15 * auVar6._12_4_ | (uint)!bVar15 * auVar96._12_4_);
            auVar107 = ZEXT1632(CONCAT412(fVar146,CONCAT48(fVar142,CONCAT44(fVar143,fVar140))));
            auVar131._0_4_ =
                 (float)((uint)(bVar90 & 1) * auVar115._0_4_ |
                        (uint)!(bool)(bVar90 & 1) * auVar199._0_4_);
            bVar15 = (bool)((byte)(uVar79 >> 1) & 1);
            auVar131._4_4_ = (float)((uint)bVar15 * auVar115._4_4_ | (uint)!bVar15 * auVar199._4_4_)
            ;
            bVar15 = (bool)((byte)(uVar79 >> 2) & 1);
            auVar131._8_4_ = (float)((uint)bVar15 * auVar115._8_4_ | (uint)!bVar15 * auVar199._8_4_)
            ;
            bVar15 = (bool)((byte)(uVar79 >> 3) & 1);
            auVar131._12_4_ =
                 (float)((uint)bVar15 * auVar115._12_4_ | (uint)!bVar15 * auVar199._12_4_);
            fVar171 = (float)((uint)((byte)(uVar79 >> 4) & 1) * auVar115._16_4_);
            auVar131._16_4_ = fVar171;
            fVar147 = (float)((uint)((byte)(uVar79 >> 5) & 1) * auVar115._20_4_);
            auVar131._20_4_ = fVar147;
            fVar184 = (float)((uint)((byte)(uVar79 >> 6) & 1) * auVar115._24_4_);
            auVar131._24_4_ = fVar184;
            iVar1 = (uint)(byte)(uVar79 >> 7) * auVar115._28_4_;
            auVar131._28_4_ = iVar1;
            auVar104 = vblendmps_avx512vl(ZEXT1632(auVar10),auVar113);
            auVar132._0_4_ =
                 (uint)(bVar90 & 1) * auVar104._0_4_ | (uint)!(bool)(bVar90 & 1) * auVar95._0_4_;
            bVar15 = (bool)((byte)(uVar79 >> 1) & 1);
            auVar132._4_4_ = (uint)bVar15 * auVar104._4_4_ | (uint)!bVar15 * auVar95._4_4_;
            bVar15 = (bool)((byte)(uVar79 >> 2) & 1);
            auVar132._8_4_ = (uint)bVar15 * auVar104._8_4_ | (uint)!bVar15 * auVar95._8_4_;
            bVar15 = (bool)((byte)(uVar79 >> 3) & 1);
            auVar132._12_4_ = (uint)bVar15 * auVar104._12_4_ | (uint)!bVar15 * auVar95._12_4_;
            auVar132._16_4_ = (uint)((byte)(uVar79 >> 4) & 1) * auVar104._16_4_;
            auVar132._20_4_ = (uint)((byte)(uVar79 >> 5) & 1) * auVar104._20_4_;
            auVar132._24_4_ = (uint)((byte)(uVar79 >> 6) & 1) * auVar104._24_4_;
            auVar132._28_4_ = (uint)(byte)(uVar79 >> 7) * auVar104._28_4_;
            auVar104 = vblendmps_avx512vl(ZEXT1632(auVar159),ZEXT1632(auVar7));
            auVar133._0_4_ =
                 (float)((uint)(bVar90 & 1) * auVar104._0_4_ |
                        (uint)!(bool)(bVar90 & 1) * auVar212._0_4_);
            bVar15 = (bool)((byte)(uVar79 >> 1) & 1);
            auVar133._4_4_ = (float)((uint)bVar15 * auVar104._4_4_ | (uint)!bVar15 * auVar212._4_4_)
            ;
            bVar15 = (bool)((byte)(uVar79 >> 2) & 1);
            auVar133._8_4_ = (float)((uint)bVar15 * auVar104._8_4_ | (uint)!bVar15 * auVar212._8_4_)
            ;
            bVar15 = (bool)((byte)(uVar79 >> 3) & 1);
            auVar133._12_4_ =
                 (float)((uint)bVar15 * auVar104._12_4_ | (uint)!bVar15 * auVar212._12_4_);
            fVar186 = (float)((uint)((byte)(uVar79 >> 4) & 1) * auVar104._16_4_);
            auVar133._16_4_ = fVar186;
            fVar185 = (float)((uint)((byte)(uVar79 >> 5) & 1) * auVar104._20_4_);
            auVar133._20_4_ = fVar185;
            fVar179 = (float)((uint)((byte)(uVar79 >> 6) & 1) * auVar104._24_4_);
            auVar133._24_4_ = fVar179;
            auVar133._28_4_ = (uint)(byte)(uVar79 >> 7) * auVar104._28_4_;
            auVar104 = vblendmps_avx512vl(ZEXT1632(auVar97),ZEXT1632(auVar8));
            auVar134._0_4_ =
                 (float)((uint)(bVar90 & 1) * auVar104._0_4_ |
                        (uint)!(bool)(bVar90 & 1) * auVar6._0_4_);
            bVar15 = (bool)((byte)(uVar79 >> 1) & 1);
            auVar134._4_4_ = (float)((uint)bVar15 * auVar104._4_4_ | (uint)!bVar15 * auVar6._4_4_);
            bVar15 = (bool)((byte)(uVar79 >> 2) & 1);
            auVar134._8_4_ = (float)((uint)bVar15 * auVar104._8_4_ | (uint)!bVar15 * auVar6._8_4_);
            bVar15 = (bool)((byte)(uVar79 >> 3) & 1);
            auVar134._12_4_ =
                 (float)((uint)bVar15 * auVar104._12_4_ | (uint)!bVar15 * auVar6._12_4_);
            fVar91 = (float)((uint)((byte)(uVar79 >> 4) & 1) * auVar104._16_4_);
            auVar134._16_4_ = fVar91;
            fVar92 = (float)((uint)((byte)(uVar79 >> 5) & 1) * auVar104._20_4_);
            auVar134._20_4_ = fVar92;
            fVar170 = (float)((uint)((byte)(uVar79 >> 6) & 1) * auVar104._24_4_);
            auVar134._24_4_ = fVar170;
            iVar2 = (uint)(byte)(uVar79 >> 7) * auVar104._28_4_;
            auVar134._28_4_ = iVar2;
            auVar135._0_4_ =
                 (uint)(bVar90 & 1) * (int)auVar10._0_4_ |
                 (uint)!(bool)(bVar90 & 1) * auVar113._0_4_;
            bVar15 = (bool)((byte)(uVar79 >> 1) & 1);
            auVar135._4_4_ = (uint)bVar15 * (int)auVar10._4_4_ | (uint)!bVar15 * auVar113._4_4_;
            bVar15 = (bool)((byte)(uVar79 >> 2) & 1);
            auVar135._8_4_ = (uint)bVar15 * (int)auVar10._8_4_ | (uint)!bVar15 * auVar113._8_4_;
            bVar15 = (bool)((byte)(uVar79 >> 3) & 1);
            auVar135._12_4_ = (uint)bVar15 * (int)auVar10._12_4_ | (uint)!bVar15 * auVar113._12_4_;
            auVar135._16_4_ = (uint)!(bool)((byte)(uVar79 >> 4) & 1) * auVar113._16_4_;
            auVar135._20_4_ = (uint)!(bool)((byte)(uVar79 >> 5) & 1) * auVar113._20_4_;
            auVar135._24_4_ = (uint)!(bool)((byte)(uVar79 >> 6) & 1) * auVar113._24_4_;
            auVar135._28_4_ = (uint)!SUB81(uVar79 >> 7,0) * auVar113._28_4_;
            bVar15 = (bool)((byte)(uVar79 >> 1) & 1);
            bVar17 = (bool)((byte)(uVar79 >> 2) & 1);
            bVar19 = (bool)((byte)(uVar79 >> 3) & 1);
            bVar16 = (bool)((byte)(uVar79 >> 1) & 1);
            bVar18 = (bool)((byte)(uVar79 >> 2) & 1);
            bVar20 = (bool)((byte)(uVar79 >> 3) & 1);
            auVar113 = vsubps_avx512vl(auVar135,auVar112);
            auVar102 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar19 * (int)auVar159._12_4_ |
                                                     (uint)!bVar19 * auVar7._12_4_,
                                                     CONCAT48((uint)bVar17 * (int)auVar159._8_4_ |
                                                              (uint)!bVar17 * auVar7._8_4_,
                                                              CONCAT44((uint)bVar15 *
                                                                       (int)auVar159._4_4_ |
                                                                       (uint)!bVar15 * auVar7._4_4_,
                                                                       (uint)(bVar90 & 1) *
                                                                       (int)auVar159._0_4_ |
                                                                       (uint)!(bool)(bVar90 & 1) *
                                                                       auVar7._0_4_)))),auVar107);
            auVar115 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar20 * (int)auVar97._12_4_ |
                                                     (uint)!bVar20 * auVar8._12_4_,
                                                     CONCAT48((uint)bVar18 * (int)auVar97._8_4_ |
                                                              (uint)!bVar18 * auVar8._8_4_,
                                                              CONCAT44((uint)bVar16 *
                                                                       (int)auVar97._4_4_ |
                                                                       (uint)!bVar16 * auVar8._4_4_,
                                                                       (uint)(bVar90 & 1) *
                                                                       (int)auVar97._0_4_ |
                                                                       (uint)!(bool)(bVar90 & 1) *
                                                                       auVar8._0_4_)))),auVar131);
            auVar114 = vsubps_avx(auVar112,auVar132);
            auVar105 = vsubps_avx(auVar107,auVar133);
            auVar103 = vsubps_avx(auVar131,auVar134);
            auVar63._4_4_ = auVar115._4_4_ * fVar141;
            auVar63._0_4_ = auVar115._0_4_ * fVar139;
            auVar63._8_4_ = auVar115._8_4_ * fVar144;
            auVar63._12_4_ = auVar115._12_4_ * fVar145;
            auVar63._16_4_ = auVar115._16_4_ * 0.0;
            auVar63._20_4_ = auVar115._20_4_ * 0.0;
            auVar63._24_4_ = auVar115._24_4_ * 0.0;
            auVar63._28_4_ = 0;
            auVar95 = vfmsub231ps_fma(auVar63,auVar131,auVar113);
            auVar177._0_4_ = fVar140 * auVar113._0_4_;
            auVar177._4_4_ = fVar143 * auVar113._4_4_;
            auVar177._8_4_ = fVar142 * auVar113._8_4_;
            auVar177._12_4_ = fVar146 * auVar113._12_4_;
            auVar177._16_4_ = auVar113._16_4_ * 0.0;
            auVar177._20_4_ = auVar113._20_4_ * 0.0;
            auVar177._24_4_ = auVar113._24_4_ * 0.0;
            auVar177._28_4_ = 0;
            auVar212 = vfmsub231ps_fma(auVar177,auVar112,auVar102);
            auVar104 = vfmadd231ps_avx512vl(ZEXT1632(auVar212),auVar100,ZEXT1632(auVar95));
            auVar182._0_4_ = auVar102._0_4_ * auVar131._0_4_;
            auVar182._4_4_ = auVar102._4_4_ * auVar131._4_4_;
            auVar182._8_4_ = auVar102._8_4_ * auVar131._8_4_;
            auVar182._12_4_ = auVar102._12_4_ * auVar131._12_4_;
            auVar182._16_4_ = auVar102._16_4_ * fVar171;
            auVar182._20_4_ = auVar102._20_4_ * fVar147;
            auVar182._24_4_ = auVar102._24_4_ * fVar184;
            auVar182._28_4_ = 0;
            auVar95 = vfmsub231ps_fma(auVar182,auVar107,auVar115);
            auVar108 = vfmadd231ps_avx512vl(auVar104,auVar100,ZEXT1632(auVar95));
            auVar104 = vmulps_avx512vl(auVar103,auVar132);
            auVar104 = vfmsub231ps_avx512vl(auVar104,auVar114,auVar134);
            auVar64._4_4_ = auVar105._4_4_ * auVar134._4_4_;
            auVar64._0_4_ = auVar105._0_4_ * auVar134._0_4_;
            auVar64._8_4_ = auVar105._8_4_ * auVar134._8_4_;
            auVar64._12_4_ = auVar105._12_4_ * auVar134._12_4_;
            auVar64._16_4_ = auVar105._16_4_ * fVar91;
            auVar64._20_4_ = auVar105._20_4_ * fVar92;
            auVar64._24_4_ = auVar105._24_4_ * fVar170;
            auVar64._28_4_ = iVar2;
            auVar95 = vfmsub231ps_fma(auVar64,auVar133,auVar103);
            auVar183._0_4_ = auVar133._0_4_ * auVar114._0_4_;
            auVar183._4_4_ = auVar133._4_4_ * auVar114._4_4_;
            auVar183._8_4_ = auVar133._8_4_ * auVar114._8_4_;
            auVar183._12_4_ = auVar133._12_4_ * auVar114._12_4_;
            auVar183._16_4_ = fVar186 * auVar114._16_4_;
            auVar183._20_4_ = fVar185 * auVar114._20_4_;
            auVar183._24_4_ = fVar179 * auVar114._24_4_;
            auVar183._28_4_ = 0;
            auVar212 = vfmsub231ps_fma(auVar183,auVar105,auVar132);
            auVar104 = vfmadd231ps_avx512vl(ZEXT1632(auVar212),auVar100,auVar104);
            auVar101 = vfmadd231ps_avx512vl(auVar104,auVar100,ZEXT1632(auVar95));
            auVar104 = vmaxps_avx(auVar108,auVar101);
            uVar149 = vcmpps_avx512vl(auVar104,auVar100,2);
            local_2d0 = local_2d0 & (byte)uVar149;
            if (local_2d0 == 0) {
LAB_01d1853e:
              local_2d0 = 0;
            }
            else {
              auVar65._4_4_ = auVar103._4_4_ * auVar102._4_4_;
              auVar65._0_4_ = auVar103._0_4_ * auVar102._0_4_;
              auVar65._8_4_ = auVar103._8_4_ * auVar102._8_4_;
              auVar65._12_4_ = auVar103._12_4_ * auVar102._12_4_;
              auVar65._16_4_ = auVar103._16_4_ * auVar102._16_4_;
              auVar65._20_4_ = auVar103._20_4_ * auVar102._20_4_;
              auVar65._24_4_ = auVar103._24_4_ * auVar102._24_4_;
              auVar65._28_4_ = auVar104._28_4_;
              auVar6 = vfmsub231ps_fma(auVar65,auVar105,auVar115);
              auVar66._4_4_ = auVar115._4_4_ * auVar114._4_4_;
              auVar66._0_4_ = auVar115._0_4_ * auVar114._0_4_;
              auVar66._8_4_ = auVar115._8_4_ * auVar114._8_4_;
              auVar66._12_4_ = auVar115._12_4_ * auVar114._12_4_;
              auVar66._16_4_ = auVar115._16_4_ * auVar114._16_4_;
              auVar66._20_4_ = auVar115._20_4_ * auVar114._20_4_;
              auVar66._24_4_ = auVar115._24_4_ * auVar114._24_4_;
              auVar66._28_4_ = auVar115._28_4_;
              auVar212 = vfmsub231ps_fma(auVar66,auVar113,auVar103);
              auVar67._4_4_ = auVar105._4_4_ * auVar113._4_4_;
              auVar67._0_4_ = auVar105._0_4_ * auVar113._0_4_;
              auVar67._8_4_ = auVar105._8_4_ * auVar113._8_4_;
              auVar67._12_4_ = auVar105._12_4_ * auVar113._12_4_;
              auVar67._16_4_ = auVar105._16_4_ * auVar113._16_4_;
              auVar67._20_4_ = auVar105._20_4_ * auVar113._20_4_;
              auVar67._24_4_ = auVar105._24_4_ * auVar113._24_4_;
              auVar67._28_4_ = auVar105._28_4_;
              auVar7 = vfmsub231ps_fma(auVar67,auVar114,auVar102);
              auVar95 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar212),ZEXT1632(auVar7));
              auVar104 = vfmadd231ps_avx512vl(ZEXT1632(auVar95),ZEXT1632(auVar6),auVar100);
              auVar102 = vrcp14ps_avx512vl(auVar104);
              auVar29._8_4_ = 0x3f800000;
              auVar29._0_8_ = &DAT_3f8000003f800000;
              auVar29._12_4_ = 0x3f800000;
              auVar29._16_4_ = 0x3f800000;
              auVar29._20_4_ = 0x3f800000;
              auVar29._24_4_ = 0x3f800000;
              auVar29._28_4_ = 0x3f800000;
              auVar115 = vfnmadd213ps_avx512vl(auVar102,auVar104,auVar29);
              auVar95 = vfmadd132ps_fma(auVar115,auVar102,auVar102);
              auVar68._4_4_ = auVar7._4_4_ * auVar131._4_4_;
              auVar68._0_4_ = auVar7._0_4_ * auVar131._0_4_;
              auVar68._8_4_ = auVar7._8_4_ * auVar131._8_4_;
              auVar68._12_4_ = auVar7._12_4_ * auVar131._12_4_;
              auVar68._16_4_ = fVar171 * 0.0;
              auVar68._20_4_ = fVar147 * 0.0;
              auVar68._24_4_ = fVar184 * 0.0;
              auVar68._28_4_ = iVar1;
              auVar212 = vfmadd231ps_fma(auVar68,auVar107,ZEXT1632(auVar212));
              auVar212 = vfmadd231ps_fma(ZEXT1632(auVar212),auVar112,ZEXT1632(auVar6));
              fVar147 = auVar95._0_4_;
              fVar184 = auVar95._4_4_;
              fVar185 = auVar95._8_4_;
              fVar186 = auVar95._12_4_;
              auVar102 = ZEXT1632(CONCAT412(auVar212._12_4_ * fVar186,
                                            CONCAT48(auVar212._8_4_ * fVar185,
                                                     CONCAT44(auVar212._4_4_ * fVar184,
                                                              auVar212._0_4_ * fVar147))));
              auVar74._4_4_ = uStack_3fc;
              auVar74._0_4_ = local_400;
              auVar74._8_4_ = uStack_3f8;
              auVar74._12_4_ = uStack_3f4;
              auVar74._16_4_ = uStack_3f0;
              auVar74._20_4_ = uStack_3ec;
              auVar74._24_4_ = uStack_3e8;
              auVar74._28_4_ = uStack_3e4;
              uVar149 = vcmpps_avx512vl(auVar102,auVar74,0xd);
              fVar171 = (ray->super_RayK<1>).tfar;
              auVar30._4_4_ = fVar171;
              auVar30._0_4_ = fVar171;
              auVar30._8_4_ = fVar171;
              auVar30._12_4_ = fVar171;
              auVar30._16_4_ = fVar171;
              auVar30._20_4_ = fVar171;
              auVar30._24_4_ = fVar171;
              auVar30._28_4_ = fVar171;
              uVar22 = vcmpps_avx512vl(auVar102,auVar30,2);
              local_2d0 = (byte)uVar149 & (byte)uVar22 & local_2d0;
              if (local_2d0 == 0) goto LAB_01d1853e;
              uVar149 = vcmpps_avx512vl(auVar104,auVar100,4);
              if ((local_2d0 & (byte)uVar149) == 0) {
                local_2d0 = 0;
              }
              else {
                local_2d0 = local_2d0 & (byte)uVar149;
                fVar171 = auVar108._0_4_ * fVar147;
                fVar179 = auVar108._4_4_ * fVar184;
                auVar69._4_4_ = fVar179;
                auVar69._0_4_ = fVar171;
                fVar91 = auVar108._8_4_ * fVar185;
                auVar69._8_4_ = fVar91;
                fVar92 = auVar108._12_4_ * fVar186;
                auVar69._12_4_ = fVar92;
                fVar170 = auVar108._16_4_ * 0.0;
                auVar69._16_4_ = fVar170;
                fVar139 = auVar108._20_4_ * 0.0;
                auVar69._20_4_ = fVar139;
                fVar140 = auVar108._24_4_ * 0.0;
                auVar69._24_4_ = fVar140;
                auVar69._28_4_ = auVar108._28_4_;
                fVar147 = auVar101._0_4_ * fVar147;
                fVar184 = auVar101._4_4_ * fVar184;
                auVar70._4_4_ = fVar184;
                auVar70._0_4_ = fVar147;
                fVar185 = auVar101._8_4_ * fVar185;
                auVar70._8_4_ = fVar185;
                fVar186 = auVar101._12_4_ * fVar186;
                auVar70._12_4_ = fVar186;
                fVar141 = auVar101._16_4_ * 0.0;
                auVar70._16_4_ = fVar141;
                fVar143 = auVar101._20_4_ * 0.0;
                auVar70._20_4_ = fVar143;
                fVar144 = auVar101._24_4_ * 0.0;
                auVar70._24_4_ = fVar144;
                auVar70._28_4_ = auVar101._28_4_;
                auVar192._8_4_ = 0x3f800000;
                auVar192._0_8_ = &DAT_3f8000003f800000;
                auVar192._12_4_ = 0x3f800000;
                auVar192._16_4_ = 0x3f800000;
                auVar192._20_4_ = 0x3f800000;
                auVar192._24_4_ = 0x3f800000;
                auVar192._28_4_ = 0x3f800000;
                auVar104 = vsubps_avx512vl(auVar192,auVar69);
                bVar15 = (bool)((byte)(uVar79 >> 1) & 1);
                bVar16 = (bool)((byte)(uVar79 >> 2) & 1);
                bVar17 = (bool)((byte)(uVar79 >> 3) & 1);
                bVar18 = (bool)((byte)(uVar79 >> 4) & 1);
                bVar19 = (bool)((byte)(uVar79 >> 5) & 1);
                bVar20 = (bool)((byte)(uVar79 >> 6) & 1);
                bVar21 = SUB81(uVar79 >> 7,0);
                in_ZMM20 = ZEXT3264(CONCAT428((uint)bVar21 * auVar108._28_4_ |
                                              (uint)!bVar21 * auVar104._28_4_,
                                              CONCAT424((uint)bVar20 * (int)fVar140 |
                                                        (uint)!bVar20 * auVar104._24_4_,
                                                        CONCAT420((uint)bVar19 * (int)fVar139 |
                                                                  (uint)!bVar19 * auVar104._20_4_,
                                                                  CONCAT416((uint)bVar18 *
                                                                            (int)fVar170 |
                                                                            (uint)!bVar18 *
                                                                            auVar104._16_4_,
                                                                            CONCAT412((uint)bVar17 *
                                                                                      (int)fVar92 |
                                                                                      (uint)!bVar17
                                                                                      * auVar104.
                                                  _12_4_,CONCAT48((uint)bVar16 * (int)fVar91 |
                                                                  (uint)!bVar16 * auVar104._8_4_,
                                                                  CONCAT44((uint)bVar15 *
                                                                           (int)fVar179 |
                                                                           (uint)!bVar15 *
                                                                           auVar104._4_4_,
                                                                           (uint)(bVar90 & 1) *
                                                                           (int)fVar171 |
                                                                           (uint)!(bool)(bVar90 & 1)
                                                                           * auVar104._0_4_))))))));
                auVar104 = vsubps_avx(auVar192,auVar70);
                bVar15 = (bool)((byte)(uVar79 >> 1) & 1);
                bVar16 = (bool)((byte)(uVar79 >> 2) & 1);
                bVar17 = (bool)((byte)(uVar79 >> 3) & 1);
                bVar18 = (bool)((byte)(uVar79 >> 4) & 1);
                bVar19 = (bool)((byte)(uVar79 >> 5) & 1);
                bVar20 = (bool)((byte)(uVar79 >> 6) & 1);
                bVar21 = SUB81(uVar79 >> 7,0);
                local_260._4_4_ = (uint)bVar15 * (int)fVar184 | (uint)!bVar15 * auVar104._4_4_;
                local_260._0_4_ =
                     (uint)(bVar90 & 1) * (int)fVar147 | (uint)!(bool)(bVar90 & 1) * auVar104._0_4_;
                local_260._8_4_ = (uint)bVar16 * (int)fVar185 | (uint)!bVar16 * auVar104._8_4_;
                local_260._12_4_ = (uint)bVar17 * (int)fVar186 | (uint)!bVar17 * auVar104._12_4_;
                local_260._16_4_ = (uint)bVar18 * (int)fVar141 | (uint)!bVar18 * auVar104._16_4_;
                local_260._20_4_ = (uint)bVar19 * (int)fVar143 | (uint)!bVar19 * auVar104._20_4_;
                local_260._24_4_ = (uint)bVar20 * (int)fVar144 | (uint)!bVar20 * auVar104._24_4_;
                local_260._28_4_ = (uint)bVar21 * auVar101._28_4_ | (uint)!bVar21 * auVar104._28_4_;
                in_ZMM21 = ZEXT3264(auVar102);
              }
            }
            auVar210 = ZEXT3264(local_540);
            auVar209 = ZEXT3264(local_520);
            auVar214 = ZEXT1664(local_620);
            auVar195 = ZEXT3264(local_5a0);
            auVar178 = ZEXT3264(local_600);
            if (local_2d0 != 0) {
              auVar104 = vsubps_avx(ZEXT1632(auVar93),auVar106);
              local_380 = in_ZMM20._0_32_;
              auVar104 = vfmadd213ps_avx512vl(auVar104,local_380,auVar106);
              auVar152._0_4_ = auVar104._0_4_ + auVar104._0_4_;
              auVar152._4_4_ = auVar104._4_4_ + auVar104._4_4_;
              auVar152._8_4_ = auVar104._8_4_ + auVar104._8_4_;
              auVar152._12_4_ = auVar104._12_4_ + auVar104._12_4_;
              auVar152._16_4_ = auVar104._16_4_ + auVar104._16_4_;
              auVar152._20_4_ = auVar104._20_4_ + auVar104._20_4_;
              auVar152._24_4_ = auVar104._24_4_ + auVar104._24_4_;
              auVar152._28_4_ = auVar104._28_4_ + auVar104._28_4_;
              fVar171 = pre->depth_scale;
              auVar31._4_4_ = fVar171;
              auVar31._0_4_ = fVar171;
              auVar31._8_4_ = fVar171;
              auVar31._12_4_ = fVar171;
              auVar31._16_4_ = fVar171;
              auVar31._20_4_ = fVar171;
              auVar31._24_4_ = fVar171;
              auVar31._28_4_ = fVar171;
              auVar104 = vmulps_avx512vl(auVar152,auVar31);
              local_340 = in_ZMM21._0_32_;
              uVar149 = vcmpps_avx512vl(local_340,auVar104,6);
              local_2d0 = local_2d0 & (byte)uVar149;
              if (local_2d0 != 0) {
                auVar153._8_4_ = 0xbf800000;
                auVar153._0_8_ = 0xbf800000bf800000;
                auVar153._12_4_ = 0xbf800000;
                auVar153._16_4_ = 0xbf800000;
                auVar153._20_4_ = 0xbf800000;
                auVar153._24_4_ = 0xbf800000;
                auVar153._28_4_ = 0xbf800000;
                auVar32._8_4_ = 0x40000000;
                auVar32._0_8_ = 0x4000000040000000;
                auVar32._12_4_ = 0x40000000;
                auVar32._16_4_ = 0x40000000;
                auVar32._20_4_ = 0x40000000;
                auVar32._24_4_ = 0x40000000;
                auVar32._28_4_ = 0x40000000;
                local_260 = vfmadd132ps_avx512vl(local_260,auVar153,auVar32);
                auVar104 = local_260;
                local_360 = local_260;
                local_320 = (int)lVar85;
                local_31c = iVar12;
                local_310 = local_620;
                local_300 = local_4d0._0_8_;
                uStack_2f8 = local_4d0._8_8_;
                local_2f0 = local_4e0._0_8_;
                uStack_2e8 = local_4e0._8_8_;
                local_2e0 = local_4f0;
                uStack_2d8 = uStack_4e8;
                pGVar13 = (context->scene->geometries).items[local_628].ptr;
                local_610._0_8_ = pGVar13;
                local_260 = auVar104;
                if ((pGVar13->mask & (ray->super_RayK<1>).mask) != 0) {
                  auVar102 = vaddps_avx512vl(local_380,_DAT_02020f40);
                  auVar95 = vcvtsi2ss_avx512f(auVar211._0_16_,(int)lVar85);
                  fVar171 = auVar95._0_4_;
                  local_2c0[0] = (fVar171 + auVar102._0_4_) * (float)local_3a0._0_4_;
                  local_2c0[1] = (fVar171 + auVar102._4_4_) * (float)local_3a0._4_4_;
                  local_2c0[2] = (fVar171 + auVar102._8_4_) * fStack_398;
                  local_2c0[3] = (fVar171 + auVar102._12_4_) * fStack_394;
                  fStack_2b0 = (fVar171 + auVar102._16_4_) * fStack_390;
                  fStack_2ac = (fVar171 + auVar102._20_4_) * fStack_38c;
                  fStack_2a8 = (fVar171 + auVar102._24_4_) * fStack_388;
                  fStack_2a4 = fVar171 + auVar102._28_4_;
                  local_2a0 = local_260._0_8_;
                  uStack_298 = local_260._8_8_;
                  uStack_290 = local_260._16_8_;
                  uStack_288 = local_260._24_8_;
                  local_280 = local_340;
                  auVar154._8_4_ = 0x7f800000;
                  auVar154._0_8_ = 0x7f8000007f800000;
                  auVar154._12_4_ = 0x7f800000;
                  auVar154._16_4_ = 0x7f800000;
                  auVar154._20_4_ = 0x7f800000;
                  auVar154._24_4_ = 0x7f800000;
                  auVar154._28_4_ = 0x7f800000;
                  auVar102 = vblendmps_avx512vl(auVar154,local_340);
                  auVar136._0_4_ =
                       (uint)(local_2d0 & 1) * auVar102._0_4_ |
                       (uint)!(bool)(local_2d0 & 1) * 0x7f800000;
                  bVar15 = (bool)(local_2d0 >> 1 & 1);
                  auVar136._4_4_ = (uint)bVar15 * auVar102._4_4_ | (uint)!bVar15 * 0x7f800000;
                  bVar15 = (bool)(local_2d0 >> 2 & 1);
                  auVar136._8_4_ = (uint)bVar15 * auVar102._8_4_ | (uint)!bVar15 * 0x7f800000;
                  bVar15 = (bool)(local_2d0 >> 3 & 1);
                  auVar136._12_4_ = (uint)bVar15 * auVar102._12_4_ | (uint)!bVar15 * 0x7f800000;
                  bVar15 = (bool)(local_2d0 >> 4 & 1);
                  auVar136._16_4_ = (uint)bVar15 * auVar102._16_4_ | (uint)!bVar15 * 0x7f800000;
                  bVar15 = (bool)(local_2d0 >> 5 & 1);
                  auVar136._20_4_ = (uint)bVar15 * auVar102._20_4_ | (uint)!bVar15 * 0x7f800000;
                  bVar15 = (bool)(local_2d0 >> 6 & 1);
                  auVar136._24_4_ = (uint)bVar15 * auVar102._24_4_ | (uint)!bVar15 * 0x7f800000;
                  auVar136._28_4_ =
                       (uint)(local_2d0 >> 7) * auVar102._28_4_ |
                       (uint)!(bool)(local_2d0 >> 7) * 0x7f800000;
                  auVar102 = vshufps_avx(auVar136,auVar136,0xb1);
                  auVar102 = vminps_avx(auVar136,auVar102);
                  auVar115 = vshufpd_avx(auVar102,auVar102,5);
                  auVar102 = vminps_avx(auVar102,auVar115);
                  auVar115 = vpermpd_avx2(auVar102,0x4e);
                  auVar102 = vminps_avx(auVar102,auVar115);
                  uVar149 = vcmpps_avx512vl(auVar136,auVar102,0);
                  bVar78 = (byte)uVar149 & local_2d0;
                  local_580 = (uint)local_2d0;
                  bVar90 = local_2d0;
                  if (bVar78 != 0) {
                    bVar90 = bVar78;
                  }
                  uVar82 = 0;
                  for (uVar81 = (uint)bVar90; (uVar81 & 1) == 0; uVar81 = uVar81 >> 1 | 0x80000000)
                  {
                    uVar82 = uVar82 + 1;
                  }
                  uVar79 = (ulong)uVar82;
                  if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                     (pGVar13->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                    fVar171 = local_2c0[uVar79];
                    fVar147 = *(float *)((long)&local_2a0 + uVar79 * 4);
                    fVar185 = 1.0 - fVar171;
                    fVar184 = fVar185 * fVar185 * -3.0;
                    auVar95 = vfmadd231ss_fma(ZEXT416((uint)(fVar185 * fVar185)),
                                              ZEXT416((uint)(fVar171 * fVar185)),ZEXT416(0xc0000000)
                                             );
                    auVar93 = vfmsub132ss_fma(ZEXT416((uint)(fVar171 * fVar185)),
                                              ZEXT416((uint)(fVar171 * fVar171)),ZEXT416(0x40000000)
                                             );
                    fVar185 = auVar95._0_4_ * 3.0;
                    fVar186 = auVar93._0_4_ * 3.0;
                    fVar179 = fVar171 * fVar171 * 3.0;
                    auVar188._0_4_ = fVar179 * (float)local_4f0._0_4_;
                    auVar188._4_4_ = fVar179 * (float)local_4f0._4_4_;
                    auVar188._8_4_ = fVar179 * (float)uStack_4e8;
                    auVar188._12_4_ = fVar179 * uStack_4e8._4_4_;
                    auVar163._4_4_ = fVar186;
                    auVar163._0_4_ = fVar186;
                    auVar163._8_4_ = fVar186;
                    auVar163._12_4_ = fVar186;
                    auVar95 = vfmadd132ps_fma(auVar163,auVar188,local_4e0);
                    auVar173._4_4_ = fVar185;
                    auVar173._0_4_ = fVar185;
                    auVar173._8_4_ = fVar185;
                    auVar173._12_4_ = fVar185;
                    auVar95 = vfmadd132ps_fma(auVar173,auVar95,local_4d0);
                    auVar164._4_4_ = fVar184;
                    auVar164._0_4_ = fVar184;
                    auVar164._8_4_ = fVar184;
                    auVar164._12_4_ = fVar184;
                    (ray->super_RayK<1>).tfar = *(float *)(local_280 + uVar79 * 4);
                    auVar95 = vfmadd213ps_fma(auVar164,local_620,auVar95);
                    uVar149 = vmovlps_avx(auVar95);
                    *(undefined8 *)&(ray->Ng).field_0 = uVar149;
                    fVar184 = (float)vextractps_avx(auVar95,2);
                    (ray->Ng).field_0.field_0.z = fVar184;
                    ray->u = fVar171;
                    ray->v = fVar147;
                    ray->primID = uVar88;
                    ray->geomID = (uint)local_628;
                    ray->instID[0] = context->user->instID[0];
                    ray->instPrimID[0] = context->user->instPrimID[0];
                    auVar195 = ZEXT3264(local_5a0);
                    auVar178 = ZEXT3264(local_600);
                  }
                  else {
                    local_1d0 = local_4d0._0_8_;
                    uStack_1c8 = local_4d0._8_8_;
                    local_1e0 = local_4e0._0_8_;
                    uStack_1d8 = local_4e0._8_8_;
                    local_1f0 = local_4f0;
                    uStack_1e8 = uStack_4e8;
                    local_460 = local_380;
                    local_480 = local_340;
                    local_630 = pPVar87;
                    local_638 = context;
                    local_640 = ray;
                    local_648 = pre;
                    do {
                      auVar212 = auVar213._0_16_;
                      local_564 = local_2c0[uVar79];
                      local_560 = *(undefined4 *)((long)&local_2a0 + uVar79 * 4);
                      local_440 = CONCAT44(local_440._4_4_,(ray->super_RayK<1>).tfar);
                      (ray->super_RayK<1>).tfar = *(float *)(local_280 + uVar79 * 4);
                      local_430 = context->user;
                      fVar147 = 1.0 - local_564;
                      fVar171 = fVar147 * fVar147 * -3.0;
                      auVar95 = vfmadd231ss_fma(ZEXT416((uint)(fVar147 * fVar147)),
                                                ZEXT416((uint)(local_564 * fVar147)),
                                                ZEXT416(0xc0000000));
                      auVar93 = vfmsub132ss_fma(ZEXT416((uint)(local_564 * fVar147)),
                                                ZEXT416((uint)(local_564 * local_564)),
                                                ZEXT416(0x40000000));
                      fVar147 = auVar95._0_4_ * 3.0;
                      fVar184 = auVar93._0_4_ * 3.0;
                      fVar185 = local_564 * local_564 * 3.0;
                      auVar189._0_4_ = fVar185 * (float)local_1f0;
                      auVar189._4_4_ = fVar185 * local_1f0._4_4_;
                      auVar189._8_4_ = fVar185 * (float)uStack_1e8;
                      auVar189._12_4_ = fVar185 * uStack_1e8._4_4_;
                      auVar165._4_4_ = fVar184;
                      auVar165._0_4_ = fVar184;
                      auVar165._8_4_ = fVar184;
                      auVar165._12_4_ = fVar184;
                      auVar75._8_8_ = uStack_1d8;
                      auVar75._0_8_ = local_1e0;
                      auVar95 = vfmadd132ps_fma(auVar165,auVar189,auVar75);
                      auVar174._4_4_ = fVar147;
                      auVar174._0_4_ = fVar147;
                      auVar174._8_4_ = fVar147;
                      auVar174._12_4_ = fVar147;
                      auVar76._8_8_ = uStack_1c8;
                      auVar76._0_8_ = local_1d0;
                      auVar95 = vfmadd132ps_fma(auVar174,auVar95,auVar76);
                      auVar166._4_4_ = fVar171;
                      auVar166._0_4_ = fVar171;
                      auVar166._8_4_ = fVar171;
                      auVar166._12_4_ = fVar171;
                      auVar95 = vfmadd213ps_fma(auVar166,auVar214._0_16_,auVar95);
                      local_570 = vmovlps_avx(auVar95);
                      local_568 = vextractps_avx(auVar95,2);
                      local_55c = uVar88;
                      local_558 = (int)local_628;
                      local_554 = local_430->instID[0];
                      local_550 = local_430->instPrimID[0];
                      local_64c = -1;
                      local_5d0.valid = &local_64c;
                      local_5d0.geometryUserPtr = *(void **)(local_610._0_8_ + 0x18);
                      local_5d0.context = local_430;
                      local_5d0.ray = (RTCRayN *)ray;
                      local_5d0.hit = (RTCHitN *)&local_570;
                      local_5d0.N = 1;
                      if (*(code **)(local_610._0_8_ + 0x40) == (code *)0x0) {
LAB_01d187e9:
                        auVar95 = auVar213._0_16_;
                        p_Var14 = context->args->filter;
                        if (p_Var14 != (RTCFilterFunctionN)0x0) {
                          if (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                               RTC_RAY_QUERY_FLAG_INCOHERENT) ||
                             ((*(byte *)(local_610._0_8_ + 0x3e) & 0x40) != 0)) {
                            (*p_Var14)(&local_5d0);
                            auVar216 = ZEXT3264(local_4c0);
                            auVar215 = ZEXT3264(local_4a0);
                            auVar210 = ZEXT3264(local_540);
                            auVar209 = ZEXT3264(local_520);
                            auVar211 = ZEXT3264(local_420);
                            auVar214 = ZEXT1664(local_620);
                            in_ZMM21 = ZEXT3264(local_480);
                            in_ZMM20 = ZEXT3264(local_460);
                            auVar95 = vxorps_avx512vl(auVar95,auVar95);
                            auVar213 = ZEXT1664(auVar95);
                            ray = local_640;
                            pre = local_648;
                            pPVar87 = local_630;
                            context = local_638;
                          }
                          if (*local_5d0.valid == 0) goto LAB_01d188ed;
                        }
                        (((Vec3f *)((long)local_5d0.ray + 0x30))->field_0).components[0] =
                             *(float *)local_5d0.hit;
                        (((Vec3f *)((long)local_5d0.ray + 0x30))->field_0).field_0.y =
                             *(float *)(local_5d0.hit + 4);
                        (((Vec3f *)((long)local_5d0.ray + 0x30))->field_0).field_0.z =
                             *(float *)(local_5d0.hit + 8);
                        *(float *)((long)local_5d0.ray + 0x3c) = *(float *)(local_5d0.hit + 0xc);
                        *(float *)((long)local_5d0.ray + 0x40) = *(float *)(local_5d0.hit + 0x10);
                        *(float *)((long)local_5d0.ray + 0x44) = *(float *)(local_5d0.hit + 0x14);
                        *(float *)((long)local_5d0.ray + 0x48) = *(float *)(local_5d0.hit + 0x18);
                        *(float *)((long)local_5d0.ray + 0x4c) = *(float *)(local_5d0.hit + 0x1c);
                        *(float *)((long)local_5d0.ray + 0x50) = *(float *)(local_5d0.hit + 0x20);
                      }
                      else {
                        (**(code **)(local_610._0_8_ + 0x40))(&local_5d0);
                        auVar216 = ZEXT3264(local_4c0);
                        auVar215 = ZEXT3264(local_4a0);
                        auVar210 = ZEXT3264(local_540);
                        auVar209 = ZEXT3264(local_520);
                        auVar211 = ZEXT3264(local_420);
                        auVar214 = ZEXT1664(local_620);
                        in_ZMM21 = ZEXT3264(local_480);
                        in_ZMM20 = ZEXT3264(local_460);
                        auVar95 = vxorps_avx512vl(auVar212,auVar212);
                        auVar213 = ZEXT1664(auVar95);
                        ray = local_640;
                        pre = local_648;
                        pPVar87 = local_630;
                        context = local_638;
                        if (*local_5d0.valid != 0) goto LAB_01d187e9;
LAB_01d188ed:
                        (ray->super_RayK<1>).tfar = (float)local_440;
                      }
                      bVar78 = ~(byte)(1 << ((uint)uVar79 & 0x1f)) & (byte)local_580;
                      fVar171 = (ray->super_RayK<1>).tfar;
                      auVar33._4_4_ = fVar171;
                      auVar33._0_4_ = fVar171;
                      auVar33._8_4_ = fVar171;
                      auVar33._12_4_ = fVar171;
                      auVar33._16_4_ = fVar171;
                      auVar33._20_4_ = fVar171;
                      auVar33._24_4_ = fVar171;
                      auVar33._28_4_ = fVar171;
                      uVar149 = vcmpps_avx512vl(in_ZMM21._0_32_,auVar33,2);
                      bVar90 = bVar78 & (byte)uVar149;
                      local_580 = (uint)bVar90;
                      auVar195 = ZEXT3264(local_5a0);
                      auVar178 = ZEXT3264(local_600);
                      if ((bVar78 & (byte)uVar149) != 0) {
                        auVar155._8_4_ = 0x7f800000;
                        auVar155._0_8_ = 0x7f8000007f800000;
                        auVar155._12_4_ = 0x7f800000;
                        auVar155._16_4_ = 0x7f800000;
                        auVar155._20_4_ = 0x7f800000;
                        auVar155._24_4_ = 0x7f800000;
                        auVar155._28_4_ = 0x7f800000;
                        auVar104 = vblendmps_avx512vl(auVar155,in_ZMM21._0_32_);
                        auVar137._0_4_ =
                             (uint)(bVar90 & 1) * auVar104._0_4_ |
                             (uint)!(bool)(bVar90 & 1) * 0x7f800000;
                        bVar15 = (bool)(bVar90 >> 1 & 1);
                        auVar137._4_4_ = (uint)bVar15 * auVar104._4_4_ | (uint)!bVar15 * 0x7f800000;
                        bVar15 = (bool)(bVar90 >> 2 & 1);
                        auVar137._8_4_ = (uint)bVar15 * auVar104._8_4_ | (uint)!bVar15 * 0x7f800000;
                        bVar15 = (bool)(bVar90 >> 3 & 1);
                        auVar137._12_4_ =
                             (uint)bVar15 * auVar104._12_4_ | (uint)!bVar15 * 0x7f800000;
                        bVar15 = (bool)(bVar90 >> 4 & 1);
                        auVar137._16_4_ =
                             (uint)bVar15 * auVar104._16_4_ | (uint)!bVar15 * 0x7f800000;
                        bVar15 = (bool)(bVar90 >> 5 & 1);
                        auVar137._20_4_ =
                             (uint)bVar15 * auVar104._20_4_ | (uint)!bVar15 * 0x7f800000;
                        bVar15 = (bool)(bVar90 >> 6 & 1);
                        auVar137._24_4_ =
                             (uint)bVar15 * auVar104._24_4_ | (uint)!bVar15 * 0x7f800000;
                        auVar137._28_4_ =
                             (uint)(bVar90 >> 7) * auVar104._28_4_ |
                             (uint)!(bool)(bVar90 >> 7) * 0x7f800000;
                        auVar104 = vshufps_avx(auVar137,auVar137,0xb1);
                        auVar104 = vminps_avx(auVar137,auVar104);
                        auVar102 = vshufpd_avx(auVar104,auVar104,5);
                        auVar104 = vminps_avx(auVar104,auVar102);
                        auVar102 = vpermpd_avx2(auVar104,0x4e);
                        auVar104 = vminps_avx(auVar104,auVar102);
                        uVar149 = vcmpps_avx512vl(auVar137,auVar104,0);
                        bVar78 = (byte)uVar149 & bVar90;
                        uVar82 = local_580;
                        if (bVar78 != 0) {
                          uVar82 = (uint)bVar78;
                        }
                        uVar81 = 0;
                        for (; (uVar82 & 1) == 0; uVar82 = uVar82 >> 1 | 0x80000000) {
                          uVar81 = uVar81 + 1;
                        }
                        uVar79 = (ulong)uVar81;
                      }
                    } while (bVar90 != 0);
                  }
                }
              }
            }
          }
          lVar85 = lVar85 + 8;
        } while ((int)lVar85 < iVar12);
      }
      fVar171 = (ray->super_RayK<1>).tfar;
      auVar28._4_4_ = fVar171;
      auVar28._0_4_ = fVar171;
      auVar28._8_4_ = fVar171;
      auVar28._12_4_ = fVar171;
      auVar28._16_4_ = fVar171;
      auVar28._20_4_ = fVar171;
      auVar28._24_4_ = fVar171;
      auVar28._28_4_ = fVar171;
      uVar149 = vcmpps_avx512vl(local_80,auVar28,2);
      uVar88 = (uint)uVar89 & (uint)uVar149;
      uVar89 = (ulong)uVar88;
    } while (uVar88 != 0);
  }
  return;
}

Assistant:

static __forceinline void intersect_t(const Precalculations& pre, RayHit& ray, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = CurveNiIntersector1<M>::intersect(ray,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = (CurveGeometry*) context->scene->get(geomID);
          const Vec3ff a0 = Vec3ff::loadu(&prim.vertices(i,N)[0]);
          const Vec3ff a1 = Vec3ff::loadu(&prim.vertices(i,N)[1]);
          const Vec3ff a2 = Vec3ff::loadu(&prim.vertices(i,N)[2]);
          const Vec3ff a3 = Vec3ff::loadu(&prim.vertices(i,N)[3]);

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            prefetchL1(&prim.vertices(i1,N)[0]);
            prefetchL1(&prim.vertices(i1,N)[4]);
            if (mask1) {
              const size_t i2 = bsf(mask1);
              prefetchL2(&prim.vertices(i2,N)[0]);
              prefetchL2(&prim.vertices(i2,N)[4]);
            }
          }

          Intersector().intersect(pre,ray,context,geom,primID,a0,a1,a2,a3,Epilog(ray,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar));
        }
      }